

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<4,8>::
     occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  uint uVar1;
  ulong uVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  __int_type_conflict _Var9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  long lVar26;
  uint uVar27;
  ulong uVar28;
  undefined8 unaff_R13;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined4 uVar95;
  vint4 bi_2;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vfloat4 b0;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  float fVar123;
  vint4 ai_2;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  vint4 bi;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  vint4 ai;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  vint4 ai_1;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar153;
  float fVar161;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  float fVar179;
  float fVar180;
  __m128 a;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  float fVar188;
  float fVar189;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar190 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar216;
  float fVar217;
  vfloat4 a0_1;
  undefined1 auVar208 [16];
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  vfloat4 a0;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [16];
  undefined1 auVar238 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  uint auStack_460 [4];
  RTCFilterFunctionNArguments local_450;
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [16];
  undefined1 local_3b0 [8];
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined1 local_360 [16];
  undefined1 local_350 [8];
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [16];
  undefined1 local_330 [16];
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  undefined1 local_2d0 [16];
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined8 uStack_240;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined4 local_1c0;
  undefined4 uStack_1bc;
  undefined4 uStack_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  ulong auStack_1a0 [4];
  RTCHitN local_180 [32];
  undefined1 local_160 [32];
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar25;
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  float fVar136;
  
  uVar24 = (ulong)(byte)prim[1];
  fVar206 = *(float *)(prim + uVar24 * 0x19 + 0x12);
  auVar37 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar37 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar37 = vsubps_avx(auVar37,*(undefined1 (*) [16])(prim + uVar24 * 0x19 + 6));
  auVar51._0_4_ = fVar206 * auVar37._0_4_;
  auVar51._4_4_ = fVar206 * auVar37._4_4_;
  auVar51._8_4_ = fVar206 * auVar37._8_4_;
  auVar51._12_4_ = fVar206 * auVar37._12_4_;
  auVar44._0_4_ = fVar206 * auVar38._0_4_;
  auVar44._4_4_ = fVar206 * auVar38._4_4_;
  auVar44._8_4_ = fVar206 * auVar38._8_4_;
  auVar44._12_4_ = fVar206 * auVar38._12_4_;
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar34 = vcvtdq2ps_avx(auVar34);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xb + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar46 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xc + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xd + 6)));
  auVar46 = vcvtdq2ps_avx(auVar46);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar62 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x12 + 6)));
  auVar62 = vcvtdq2ps_avx(auVar62);
  auVar237 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x13 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x14 + 6)));
  auVar237 = vcvtdq2ps_avx(auVar237);
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar57._4_4_ = auVar44._0_4_;
  auVar57._0_4_ = auVar44._0_4_;
  auVar57._8_4_ = auVar44._0_4_;
  auVar57._12_4_ = auVar44._0_4_;
  auVar40 = vshufps_avx(auVar44,auVar44,0x55);
  auVar41 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar206 = auVar41._0_4_;
  auVar53._0_4_ = fVar206 * auVar34._0_4_;
  fVar189 = auVar41._4_4_;
  auVar53._4_4_ = fVar189 * auVar34._4_4_;
  fVar200 = auVar41._8_4_;
  auVar53._8_4_ = fVar200 * auVar34._8_4_;
  fVar202 = auVar41._12_4_;
  auVar53._12_4_ = fVar202 * auVar34._12_4_;
  auVar55._0_4_ = auVar35._0_4_ * fVar206;
  auVar55._4_4_ = auVar35._4_4_ * fVar189;
  auVar55._8_4_ = auVar35._8_4_ * fVar200;
  auVar55._12_4_ = auVar35._12_4_ * fVar202;
  auVar45._0_4_ = auVar36._0_4_ * fVar206;
  auVar45._4_4_ = auVar36._4_4_ * fVar189;
  auVar45._8_4_ = auVar36._8_4_ * fVar200;
  auVar45._12_4_ = auVar36._12_4_ * fVar202;
  auVar41 = vfmadd231ps_fma(auVar53,auVar40,auVar38);
  auVar42 = vfmadd231ps_fma(auVar55,auVar40,auVar46);
  auVar40 = vfmadd231ps_fma(auVar45,auVar237,auVar40);
  auVar43 = vfmadd231ps_fma(auVar41,auVar57,auVar37);
  auVar42 = vfmadd231ps_fma(auVar42,auVar57,auVar39);
  auVar44 = vfmadd231ps_fma(auVar40,auVar62,auVar57);
  auVar59._4_4_ = auVar51._0_4_;
  auVar59._0_4_ = auVar51._0_4_;
  auVar59._8_4_ = auVar51._0_4_;
  auVar59._12_4_ = auVar51._0_4_;
  auVar40 = vshufps_avx(auVar51,auVar51,0x55);
  auVar41 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar34 = vmulps_avx512vl(auVar41,auVar34);
  auVar54._0_4_ = auVar41._0_4_ * auVar35._0_4_;
  auVar54._4_4_ = auVar41._4_4_ * auVar35._4_4_;
  auVar54._8_4_ = auVar41._8_4_ * auVar35._8_4_;
  auVar54._12_4_ = auVar41._12_4_ * auVar35._12_4_;
  auVar50._0_4_ = auVar41._0_4_ * auVar36._0_4_;
  auVar50._4_4_ = auVar41._4_4_ * auVar36._4_4_;
  auVar50._8_4_ = auVar41._8_4_ * auVar36._8_4_;
  auVar50._12_4_ = auVar41._12_4_ * auVar36._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar34,auVar40,auVar38);
  auVar38 = vfmadd231ps_fma(auVar54,auVar40,auVar46);
  auVar34 = vfmadd231ps_fma(auVar50,auVar40,auVar237);
  auVar36 = vfmadd231ps_avx512vl(auVar35,auVar59,auVar37);
  auVar46 = vfmadd231ps_fma(auVar38,auVar59,auVar39);
  auVar237 = vfmadd231ps_fma(auVar34,auVar59,auVar62);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar236 = ZEXT1664(auVar37);
  auVar48._8_4_ = 0x219392ef;
  auVar48._0_8_ = 0x219392ef219392ef;
  auVar48._12_4_ = 0x219392ef;
  auVar38 = vandps_avx512vl(auVar43,auVar37);
  uVar29 = vcmpps_avx512vl(auVar38,auVar48,1);
  bVar11 = (bool)((byte)uVar29 & 1);
  auVar41._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar43._0_4_;
  bVar11 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar41._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar43._4_4_;
  bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar41._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar43._8_4_;
  bVar11 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar41._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar43._12_4_;
  auVar38 = vandps_avx512vl(auVar42,auVar37);
  uVar29 = vcmpps_avx512vl(auVar38,auVar48,1);
  bVar11 = (bool)((byte)uVar29 & 1);
  auVar43._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar42._0_4_;
  bVar11 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar43._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar42._4_4_;
  bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar43._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar42._8_4_;
  bVar11 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar43._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar42._12_4_;
  auVar37 = vandps_avx512vl(auVar44,auVar37);
  uVar29 = vcmpps_avx512vl(auVar37,auVar48,1);
  bVar11 = (bool)((byte)uVar29 & 1);
  auVar42._0_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar44._0_4_;
  bVar11 = (bool)((byte)(uVar29 >> 1) & 1);
  auVar42._4_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar44._4_4_;
  bVar11 = (bool)((byte)(uVar29 >> 2) & 1);
  auVar42._8_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar44._8_4_;
  bVar11 = (bool)((byte)(uVar29 >> 3) & 1);
  auVar42._12_4_ = (uint)bVar11 * 0x219392ef | (uint)!bVar11 * auVar44._12_4_;
  auVar37 = vrcp14ps_avx512vl(auVar41);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar238 = ZEXT1664(auVar38);
  auVar34 = vfnmadd213ps_avx512vl(auVar41,auVar37,auVar38);
  auVar34 = vfmadd132ps_fma(auVar34,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar43);
  auVar39 = vfnmadd213ps_avx512vl(auVar43,auVar37,auVar38);
  auVar35 = vfmadd132ps_fma(auVar39,auVar37,auVar37);
  auVar37 = vrcp14ps_avx512vl(auVar42);
  auVar38 = vfnmadd213ps_avx512vl(auVar42,auVar37,auVar38);
  auVar62 = vfmadd132ps_fma(auVar38,auVar37,auVar37);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar37 = vpmovsxwd_avx(auVar37);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx512vl(auVar37,auVar36);
  auVar49._0_4_ = auVar34._0_4_ * auVar37._0_4_;
  auVar49._4_4_ = auVar34._4_4_ * auVar37._4_4_;
  auVar49._8_4_ = auVar34._8_4_ * auVar37._8_4_;
  auVar49._12_4_ = auVar34._12_4_ * auVar37._12_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar37 = vpmovsxwd_avx(auVar38);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx512vl(auVar37,auVar36);
  auVar61._0_4_ = auVar34._0_4_ * auVar37._0_4_;
  auVar61._4_4_ = auVar34._4_4_ * auVar37._4_4_;
  auVar61._8_4_ = auVar34._8_4_ * auVar37._8_4_;
  auVar61._12_4_ = auVar34._12_4_ * auVar37._12_4_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar24 * 0xe + 6);
  auVar37 = vpmovsxwd_avx(auVar34);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar46);
  auVar56._0_4_ = auVar35._0_4_ * auVar37._0_4_;
  auVar56._4_4_ = auVar35._4_4_ * auVar37._4_4_;
  auVar56._8_4_ = auVar35._8_4_ * auVar37._8_4_;
  auVar56._12_4_ = auVar35._12_4_ * auVar37._12_4_;
  auVar34 = vpbroadcastd_avx512vl();
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar37 = vpmovsxwd_avx(auVar39);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar38 = vsubps_avx(auVar37,auVar46);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar24 * 0x15 + 6);
  auVar37 = vpmovsxwd_avx(auVar46);
  auVar58._0_4_ = auVar35._0_4_ * auVar38._0_4_;
  auVar58._4_4_ = auVar35._4_4_ * auVar38._4_4_;
  auVar58._8_4_ = auVar35._8_4_ * auVar38._8_4_;
  auVar58._12_4_ = auVar35._12_4_ * auVar38._12_4_;
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar237);
  auVar52._0_4_ = auVar62._0_4_ * auVar37._0_4_;
  auVar52._4_4_ = auVar62._4_4_ * auVar37._4_4_;
  auVar52._8_4_ = auVar62._8_4_ * auVar37._8_4_;
  auVar52._12_4_ = auVar62._12_4_ * auVar37._12_4_;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar24 * 0x17 + 6);
  auVar37 = vpmovsxwd_avx(auVar35);
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar37 = vsubps_avx(auVar37,auVar237);
  auVar47._0_4_ = auVar62._0_4_ * auVar37._0_4_;
  auVar47._4_4_ = auVar62._4_4_ * auVar37._4_4_;
  auVar47._8_4_ = auVar62._8_4_ * auVar37._8_4_;
  auVar47._12_4_ = auVar62._12_4_ * auVar37._12_4_;
  auVar37 = vpminsd_avx(auVar49,auVar61);
  auVar38 = vpminsd_avx(auVar56,auVar58);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar38 = vpminsd_avx(auVar52,auVar47);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar62._4_4_ = uVar95;
  auVar62._0_4_ = uVar95;
  auVar62._8_4_ = uVar95;
  auVar62._12_4_ = uVar95;
  auVar38 = vmaxps_avx512vl(auVar38,auVar62);
  auVar37 = vmaxps_avx(auVar37,auVar38);
  auVar237._8_4_ = 0x3f7ffffa;
  auVar237._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar237._12_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar37,auVar237);
  auVar37 = vpmaxsd_avx(auVar49,auVar61);
  auVar38 = vpmaxsd_avx(auVar56,auVar58);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar38 = vpmaxsd_avx(auVar52,auVar47);
  uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar36._4_4_ = uVar95;
  auVar36._0_4_ = uVar95;
  auVar36._8_4_ = uVar95;
  auVar36._12_4_ = uVar95;
  auVar38 = vminps_avx512vl(auVar38,auVar36);
  auVar37 = vminps_avx(auVar37,auVar38);
  auVar40._8_4_ = 0x3f800003;
  auVar40._0_8_ = 0x3f8000033f800003;
  auVar40._12_4_ = 0x3f800003;
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  uVar16 = vcmpps_avx512vl(local_3c0,auVar37,2);
  uVar17 = vpcmpgtd_avx512vl(auVar34,_DAT_01f4ad30);
  uVar29 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar16 & 0xf & (byte)uVar17));
  local_220 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar232 = ZEXT1664(auVar37);
  auVar240 = ZEXT464(0x3f800000);
  auVar37 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
  auVar239 = ZEXT1664(auVar37);
LAB_017e169d:
  if (uVar29 == 0) {
LAB_017e31c2:
    return uVar29 != 0;
  }
  lVar26 = 0;
  for (uVar24 = uVar29; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar26 = lVar26 + 1;
  }
  uVar5 = *(uint *)(prim + 2);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           (ulong)*(uint *)(prim + lVar26 * 4 + 6) *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar37 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * uVar24);
  lVar26 = uVar24 + 1;
  auVar38 = *(undefined1 (*) [16])(lVar8 + (long)pGVar7[1].intersectionFilterN * lVar26);
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar34 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * uVar24);
  auVar39 = *(undefined1 (*) [16])(_Var9 + (long)pGVar7[2].userPtr * lVar26);
  local_1e0 = vpbroadcastd_avx512vl();
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar46 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar36 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * uVar24),
                       auVar37,auVar40);
  auVar41 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (pGVar7[2].intersectionFilterN + (long)pGVar7[2].pointQueryFunc * lVar26),
                       auVar38,auVar40);
  auVar42 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + uVar24 * *(long *)&pGVar7[3].fnumTimeSegments),
                       auVar34,auVar40);
  auVar43 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        ((long)pGVar7[3].userPtr + *(long *)&pGVar7[3].fnumTimeSegments * lVar26),
                       auVar39,auVar40);
  auVar47 = ZEXT816(0) << 0x40;
  auVar154._0_4_ = auVar38._0_4_ * 0.0;
  auVar154._4_4_ = auVar38._4_4_ * 0.0;
  auVar154._8_4_ = auVar38._8_4_ * 0.0;
  auVar154._12_4_ = auVar38._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar154,auVar41,auVar47);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar36,auVar62);
  auVar162._0_4_ = auVar35._0_4_ + auVar37._0_4_;
  auVar162._4_4_ = auVar35._4_4_ + auVar37._4_4_;
  auVar162._8_4_ = auVar35._8_4_ + auVar37._8_4_;
  auVar162._12_4_ = auVar35._12_4_ + auVar37._12_4_;
  auVar55 = auVar231._0_16_;
  auVar35 = vfmadd231ps_avx512vl(auVar62,auVar36,auVar55);
  auVar44 = vfnmadd231ps_avx512vl(auVar35,auVar37,auVar55);
  auVar208._0_4_ = auVar39._0_4_ * 0.0;
  auVar208._4_4_ = auVar39._4_4_ * 0.0;
  auVar208._8_4_ = auVar39._8_4_ * 0.0;
  auVar208._12_4_ = auVar39._12_4_ * 0.0;
  auVar62 = vfmadd231ps_fma(auVar208,auVar43,auVar47);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar62);
  auVar219._0_4_ = auVar35._0_4_ + auVar34._0_4_;
  auVar219._4_4_ = auVar35._4_4_ + auVar34._4_4_;
  auVar219._8_4_ = auVar35._8_4_ + auVar34._8_4_;
  auVar219._12_4_ = auVar35._12_4_ + auVar34._12_4_;
  auVar35 = vfmadd231ps_avx512vl(auVar62,auVar42,auVar55);
  auVar45 = vfnmadd231ps_avx512vl(auVar35,auVar34,auVar55);
  auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar38);
  auVar35 = vfmadd231ps_fma(auVar35,auVar36,auVar47);
  auVar237 = vfmadd231ps_fma(auVar35,auVar37,auVar47);
  auVar38 = vmulps_avx512vl(auVar38,auVar55);
  auVar38 = vfnmadd231ps_avx512vl(auVar38,auVar55,auVar41);
  auVar38 = vfmadd231ps_fma(auVar38,auVar47,auVar36);
  auVar36 = vfnmadd231ps_fma(auVar38,auVar47,auVar37);
  auVar37 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar39);
  auVar37 = vfmadd231ps_fma(auVar37,auVar42,auVar47);
  auVar35 = vfmadd231ps_fma(auVar37,auVar34,auVar47);
  auVar37 = vmulps_avx512vl(auVar39,auVar55);
  auVar37 = vfnmadd231ps_avx512vl(auVar37,auVar55,auVar43);
  auVar37 = vfmadd231ps_fma(auVar37,auVar47,auVar42);
  auVar62 = vfnmadd231ps_fma(auVar37,auVar47,auVar34);
  auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar38 = vshufps_avx(auVar219,auVar219,0xc9);
  fVar153 = auVar44._0_4_;
  auVar128._0_4_ = fVar153 * auVar38._0_4_;
  fVar161 = auVar44._4_4_;
  auVar128._4_4_ = fVar161 * auVar38._4_4_;
  fVar204 = auVar44._8_4_;
  auVar128._8_4_ = fVar204 * auVar38._8_4_;
  fVar205 = auVar44._12_4_;
  auVar128._12_4_ = fVar205 * auVar38._12_4_;
  auVar38 = vfmsub231ps_fma(auVar128,auVar37,auVar219);
  auVar34 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar137._0_4_ = fVar153 * auVar38._0_4_;
  auVar137._4_4_ = fVar161 * auVar38._4_4_;
  auVar137._8_4_ = fVar204 * auVar38._8_4_;
  auVar137._12_4_ = fVar205 * auVar38._12_4_;
  auVar37 = vfmsub231ps_fma(auVar137,auVar37,auVar45);
  auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar38 = vshufps_avx(auVar35,auVar35,0xc9);
  fVar206 = auVar36._0_4_;
  auVar181._0_4_ = auVar38._0_4_ * fVar206;
  fVar189 = auVar36._4_4_;
  auVar181._4_4_ = auVar38._4_4_ * fVar189;
  fVar200 = auVar36._8_4_;
  auVar181._8_4_ = auVar38._8_4_ * fVar200;
  fVar202 = auVar36._12_4_;
  auVar181._12_4_ = auVar38._12_4_ * fVar202;
  auVar38 = vfmsub231ps_fma(auVar181,auVar37,auVar35);
  auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar182._0_4_ = auVar38._0_4_ * fVar206;
  auVar182._4_4_ = auVar38._4_4_ * fVar189;
  auVar182._8_4_ = auVar38._8_4_ * fVar200;
  auVar182._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmsub231ps_fma(auVar182,auVar37,auVar62);
  auVar62 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar37 = vdpps_avx(auVar34,auVar34,0x7f);
  fVar123 = auVar37._0_4_;
  auVar183._4_12_ = ZEXT812(0) << 0x20;
  auVar183._0_4_ = fVar123;
  auVar38 = vrsqrt14ss_avx512f(auVar47,auVar183);
  auVar41 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar136 = auVar38._0_4_;
  fVar180 = auVar41._0_4_ - auVar42._0_4_ * fVar136 * fVar136 * fVar136;
  fVar207 = fVar180 * auVar34._0_4_;
  fVar216 = fVar180 * auVar34._4_4_;
  fVar217 = fVar180 * auVar34._8_4_;
  fVar218 = fVar180 * auVar34._12_4_;
  auVar38 = vdpps_avx(auVar34,auVar39,0x7f);
  auVar138._0_4_ = fVar123 * auVar39._0_4_;
  auVar138._4_4_ = fVar123 * auVar39._4_4_;
  auVar138._8_4_ = fVar123 * auVar39._8_4_;
  auVar138._12_4_ = fVar123 * auVar39._12_4_;
  fVar123 = auVar38._0_4_;
  auVar129._0_4_ = fVar123 * auVar34._0_4_;
  auVar129._4_4_ = fVar123 * auVar34._4_4_;
  auVar129._8_4_ = fVar123 * auVar34._8_4_;
  auVar129._12_4_ = fVar123 * auVar34._12_4_;
  auVar34 = vsubps_avx(auVar138,auVar129);
  auVar38 = vrcp14ss_avx512f(auVar47,auVar183);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar38,ZEXT416(0x40000000));
  fVar123 = auVar38._0_4_ * auVar37._0_4_;
  auVar37 = vdpps_avx(auVar35,auVar35,0x7f);
  fVar136 = auVar37._0_4_;
  auVar130._4_12_ = ZEXT812(0) << 0x20;
  auVar130._0_4_ = fVar136;
  auVar38 = vrsqrt14ss_avx512f(auVar47,auVar130);
  auVar39 = vmulss_avx512f(auVar38,ZEXT416(0x3fc00000));
  auVar41 = vmulss_avx512f(auVar37,ZEXT416(0x3f000000));
  fVar179 = auVar38._0_4_;
  fVar179 = auVar39._0_4_ - auVar41._0_4_ * fVar179 * fVar179 * fVar179;
  fVar188 = fVar179 * auVar35._0_4_;
  fVar199 = fVar179 * auVar35._4_4_;
  fVar201 = fVar179 * auVar35._8_4_;
  fVar203 = fVar179 * auVar35._12_4_;
  auVar38 = vdpps_avx(auVar35,auVar62,0x7f);
  auVar107._0_4_ = fVar136 * auVar62._0_4_;
  auVar107._4_4_ = fVar136 * auVar62._4_4_;
  auVar107._8_4_ = fVar136 * auVar62._8_4_;
  auVar107._12_4_ = fVar136 * auVar62._12_4_;
  fVar136 = auVar38._0_4_;
  auVar96._0_4_ = fVar136 * auVar35._0_4_;
  auVar96._4_4_ = fVar136 * auVar35._4_4_;
  auVar96._8_4_ = fVar136 * auVar35._8_4_;
  auVar96._12_4_ = fVar136 * auVar35._12_4_;
  auVar39 = vsubps_avx(auVar107,auVar96);
  auVar38 = vrcp14ss_avx512f(auVar47,auVar130);
  auVar37 = vfnmadd213ss_avx512f(auVar37,auVar38,ZEXT416(0x40000000));
  fVar136 = auVar38._0_4_ * auVar37._0_4_;
  auVar37 = vshufps_avx(auVar162,auVar162,0xff);
  auVar131._0_4_ = fVar207 * auVar37._0_4_;
  auVar131._4_4_ = fVar216 * auVar37._4_4_;
  auVar131._8_4_ = fVar217 * auVar37._8_4_;
  auVar131._12_4_ = fVar218 * auVar37._12_4_;
  local_340 = vsubps_avx(auVar162,auVar131);
  auVar38 = vshufps_avx(auVar44,auVar44,0xff);
  auVar108._0_4_ = fVar207 * auVar38._0_4_ + auVar37._0_4_ * fVar180 * auVar34._0_4_ * fVar123;
  auVar108._4_4_ = fVar216 * auVar38._4_4_ + auVar37._4_4_ * fVar180 * auVar34._4_4_ * fVar123;
  auVar108._8_4_ = fVar217 * auVar38._8_4_ + auVar37._8_4_ * fVar180 * auVar34._8_4_ * fVar123;
  auVar108._12_4_ = fVar218 * auVar38._12_4_ + auVar37._12_4_ * fVar180 * auVar34._12_4_ * fVar123;
  auVar34 = vsubps_avx(auVar44,auVar108);
  local_350._0_4_ = auVar162._0_4_ + auVar131._0_4_;
  local_350._4_4_ = auVar162._4_4_ + auVar131._4_4_;
  fStack_348 = auVar162._8_4_ + auVar131._8_4_;
  fStack_344 = auVar162._12_4_ + auVar131._12_4_;
  auVar109._0_4_ = fVar153 + auVar108._0_4_;
  auVar109._4_4_ = fVar161 + auVar108._4_4_;
  auVar109._8_4_ = fVar204 + auVar108._8_4_;
  auVar109._12_4_ = fVar205 + auVar108._12_4_;
  auVar37 = vshufps_avx(auVar237,auVar237,0xff);
  auVar139._0_4_ = fVar188 * auVar37._0_4_;
  auVar139._4_4_ = fVar199 * auVar37._4_4_;
  auVar139._8_4_ = fVar201 * auVar37._8_4_;
  auVar139._12_4_ = fVar203 * auVar37._12_4_;
  local_360 = vsubps_avx(auVar237,auVar139);
  auVar38 = vshufps_avx(auVar36,auVar36,0xff);
  auVar97._0_4_ = fVar188 * auVar38._0_4_ + auVar37._0_4_ * fVar179 * auVar39._0_4_ * fVar136;
  auVar97._4_4_ = fVar199 * auVar38._4_4_ + auVar37._4_4_ * fVar179 * auVar39._4_4_ * fVar136;
  auVar97._8_4_ = fVar201 * auVar38._8_4_ + auVar37._8_4_ * fVar179 * auVar39._8_4_ * fVar136;
  auVar97._12_4_ = fVar203 * auVar38._12_4_ + auVar37._12_4_ * fVar179 * auVar39._12_4_ * fVar136;
  auVar37 = vsubps_avx(auVar36,auVar97);
  _local_370 = vaddps_avx512vl(auVar237,auVar139);
  auVar98._0_4_ = fVar206 + auVar97._0_4_;
  auVar98._4_4_ = fVar189 + auVar97._4_4_;
  auVar98._8_4_ = fVar200 + auVar97._8_4_;
  auVar98._12_4_ = fVar202 + auVar97._12_4_;
  auVar38 = vmulps_avx512vl(auVar34,auVar40);
  local_380 = vaddps_avx512vl(local_340,auVar38);
  auVar37 = vmulps_avx512vl(auVar37,auVar40);
  local_390 = vsubps_avx512vl(local_360,auVar37);
  auVar37 = vmulps_avx512vl(auVar109,auVar40);
  _local_3a0 = vaddps_avx512vl(_local_350,auVar37);
  auVar37 = vmulps_avx512vl(auVar98,auVar40);
  _local_3b0 = vsubps_avx512vl(_local_370,auVar37);
  local_2c0 = vsubps_avx(local_340,auVar46);
  uVar95 = local_2c0._0_4_;
  auVar104._4_4_ = uVar95;
  auVar104._0_4_ = uVar95;
  auVar104._8_4_ = uVar95;
  auVar104._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_2c0,local_2c0,0x55);
  auVar38 = vshufps_avx(local_2c0,local_2c0,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar206 = pre->ray_space[k].vz.field_0.m128[0];
  fVar189 = pre->ray_space[k].vz.field_0.m128[1];
  fVar200 = pre->ray_space[k].vz.field_0.m128[2];
  fVar202 = pre->ray_space[k].vz.field_0.m128[3];
  auVar99._0_4_ = fVar206 * auVar38._0_4_;
  auVar99._4_4_ = fVar189 * auVar38._4_4_;
  auVar99._8_4_ = fVar200 * auVar38._8_4_;
  auVar99._12_4_ = fVar202 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar37);
  auVar62 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar104);
  local_2d0 = vsubps_avx512vl(local_380,auVar46);
  uVar95 = local_2d0._0_4_;
  auVar110._4_4_ = uVar95;
  auVar110._0_4_ = uVar95;
  auVar110._8_4_ = uVar95;
  auVar110._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_2d0,local_2d0,0x55);
  auVar38 = vshufps_avx(local_2d0,local_2d0,0xaa);
  auVar105._0_4_ = fVar206 * auVar38._0_4_;
  auVar105._4_4_ = fVar189 * auVar38._4_4_;
  auVar105._8_4_ = fVar200 * auVar38._8_4_;
  auVar105._12_4_ = fVar202 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar105,(undefined1  [16])aVar4,auVar37);
  auVar237 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar110);
  local_2e0 = vsubps_avx512vl(local_390,auVar46);
  uVar95 = local_2e0._0_4_;
  auVar111._4_4_ = uVar95;
  auVar111._0_4_ = uVar95;
  auVar111._8_4_ = uVar95;
  auVar111._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_2e0,local_2e0,0x55);
  auVar38 = vshufps_avx(local_2e0,local_2e0,0xaa);
  auVar163._0_4_ = auVar38._0_4_ * fVar206;
  auVar163._4_4_ = auVar38._4_4_ * fVar189;
  auVar163._8_4_ = auVar38._8_4_ * fVar200;
  auVar163._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar163,(undefined1  [16])aVar4,auVar37);
  auVar36 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar111);
  local_2f0 = vsubps_avx(local_360,auVar46);
  uVar95 = local_2f0._0_4_;
  auVar112._4_4_ = uVar95;
  auVar112._0_4_ = uVar95;
  auVar112._8_4_ = uVar95;
  auVar112._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_2f0,local_2f0,0x55);
  auVar38 = vshufps_avx(local_2f0,local_2f0,0xaa);
  auVar169._0_4_ = auVar38._0_4_ * fVar206;
  auVar169._4_4_ = auVar38._4_4_ * fVar189;
  auVar169._8_4_ = auVar38._8_4_ * fVar200;
  auVar169._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar169,(undefined1  [16])aVar4,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar112);
  local_300 = vsubps_avx(_local_350,auVar46);
  uVar95 = local_300._0_4_;
  auVar113._4_4_ = uVar95;
  auVar113._0_4_ = uVar95;
  auVar113._8_4_ = uVar95;
  auVar113._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_300,local_300,0x55);
  auVar38 = vshufps_avx(local_300,local_300,0xaa);
  auVar184._0_4_ = auVar38._0_4_ * fVar206;
  auVar184._4_4_ = auVar38._4_4_ * fVar189;
  auVar184._8_4_ = auVar38._8_4_ * fVar200;
  auVar184._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar184,(undefined1  [16])aVar4,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar113);
  local_310 = vsubps_avx512vl(_local_3a0,auVar46);
  uVar95 = local_310._0_4_;
  auVar114._4_4_ = uVar95;
  auVar114._0_4_ = uVar95;
  auVar114._8_4_ = uVar95;
  auVar114._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_310,local_310,0x55);
  auVar38 = vshufps_avx(local_310,local_310,0xaa);
  auVar190._0_4_ = auVar38._0_4_ * fVar206;
  auVar190._4_4_ = auVar38._4_4_ * fVar189;
  auVar190._8_4_ = auVar38._8_4_ * fVar200;
  auVar190._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar4,auVar37);
  auVar42 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar114);
  local_320 = vsubps_avx512vl(_local_3b0,auVar46);
  uVar95 = local_320._0_4_;
  auVar115._4_4_ = uVar95;
  auVar115._0_4_ = uVar95;
  auVar115._8_4_ = uVar95;
  auVar115._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_320,local_320,0x55);
  auVar38 = vshufps_avx(local_320,local_320,0xaa);
  auVar209._0_4_ = auVar38._0_4_ * fVar206;
  auVar209._4_4_ = auVar38._4_4_ * fVar189;
  auVar209._8_4_ = auVar38._8_4_ * fVar200;
  auVar209._12_4_ = auVar38._12_4_ * fVar202;
  auVar37 = vfmadd231ps_fma(auVar209,(undefined1  [16])aVar4,auVar37);
  auVar43 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar115);
  local_330 = vsubps_avx512vl(_local_370,auVar46);
  uVar95 = local_330._0_4_;
  auVar116._4_4_ = uVar95;
  auVar116._0_4_ = uVar95;
  auVar116._8_4_ = uVar95;
  auVar116._12_4_ = uVar95;
  auVar37 = vshufps_avx(local_330,local_330,0x55);
  auVar38 = vshufps_avx(local_330,local_330,0xaa);
  auVar140._0_4_ = fVar206 * auVar38._0_4_;
  auVar140._4_4_ = fVar189 * auVar38._4_4_;
  auVar140._8_4_ = fVar200 * auVar38._8_4_;
  auVar140._12_4_ = fVar202 * auVar38._12_4_;
  auVar37 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar4,auVar37);
  auVar44 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar116);
  auVar34 = vmovlhps_avx(auVar62,auVar41);
  auVar39 = vmovlhps_avx(auVar237,auVar42);
  auVar35 = vmovlhps_avx512f(auVar36,auVar43);
  _local_2a0 = vmovlhps_avx512f(auVar40,auVar44);
  auVar38 = vminps_avx(auVar34,auVar39);
  auVar37 = vmaxps_avx(auVar34,auVar39);
  auVar46 = vminps_avx512vl(auVar35,_local_2a0);
  auVar38 = vminps_avx(auVar38,auVar46);
  auVar46 = vmaxps_avx512vl(auVar35,_local_2a0);
  auVar37 = vmaxps_avx(auVar37,auVar46);
  auVar46 = vshufpd_avx(auVar38,auVar38,3);
  auVar38 = vminps_avx(auVar38,auVar46);
  auVar46 = vshufpd_avx(auVar37,auVar37,3);
  auVar37 = vmaxps_avx(auVar37,auVar46);
  auVar38 = vandps_avx512vl(auVar38,auVar236._0_16_);
  auVar37 = vandps_avx512vl(auVar37,auVar236._0_16_);
  auVar37 = vmaxps_avx(auVar38,auVar37);
  auVar38 = vmovshdup_avx(auVar37);
  auVar37 = vmaxss_avx(auVar38,auVar37);
  auVar38 = vmovddup_avx512vl(auVar62);
  auVar46 = vmovddup_avx512vl(auVar237);
  auVar164._0_8_ = auVar36._0_8_;
  auVar164._8_8_ = auVar164._0_8_;
  auVar170._0_8_ = auVar40._0_8_;
  auVar170._8_8_ = auVar170._0_8_;
  local_2b0 = ZEXT416((uint)(auVar37._0_4_ * 9.536743e-07));
  local_260 = vbroadcastss_avx512vl(local_2b0);
  auVar37 = vxorps_avx512vl(local_260._0_16_,auVar232._0_16_);
  local_1c0 = auVar37._0_4_;
  uStack_1bc = local_1c0;
  uStack_1b8 = local_1c0;
  uStack_1b4 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1ac = local_1c0;
  uStack_1a8 = local_1c0;
  uStack_1a4 = local_1c0;
  bVar11 = false;
  uVar24 = 0;
  uVar1 = *(uint *)(ray + k * 4 + 0x60);
  local_270 = vsubps_avx(auVar39,auVar34);
  local_280 = vsubps_avx512vl(auVar35,auVar39);
  local_290 = vsubps_avx512vl(_local_2a0,auVar35);
  local_3d0 = vsubps_avx(_local_350,local_340);
  local_3e0 = vsubps_avx512vl(_local_3a0,local_380);
  local_3f0 = vsubps_avx512vl(_local_3b0,local_390);
  _local_400 = vsubps_avx512vl(_local_370,local_360);
  local_200 = vpbroadcastd_avx512vl();
  auVar37 = ZEXT816(0x3f80000000000000);
  auVar60 = auVar37;
LAB_017e1da0:
  auVar62 = vshufps_avx(auVar60,auVar60,0x50);
  auVar223._8_4_ = 0x3f800000;
  auVar223._0_8_ = 0x3f8000003f800000;
  auVar223._12_4_ = 0x3f800000;
  auVar83._16_4_ = 0x3f800000;
  auVar83._0_16_ = auVar223;
  auVar83._20_4_ = 0x3f800000;
  auVar83._24_4_ = 0x3f800000;
  auVar83._28_4_ = 0x3f800000;
  auVar237 = vsubps_avx(auVar223,auVar62);
  fVar206 = auVar62._0_4_;
  fVar123 = auVar41._0_4_;
  auVar132._0_4_ = fVar123 * fVar206;
  fVar189 = auVar62._4_4_;
  fVar136 = auVar41._4_4_;
  auVar132._4_4_ = fVar136 * fVar189;
  fVar200 = auVar62._8_4_;
  auVar132._8_4_ = fVar123 * fVar200;
  fVar202 = auVar62._12_4_;
  auVar132._12_4_ = fVar136 * fVar202;
  fVar180 = auVar42._0_4_;
  auVar141._0_4_ = fVar180 * fVar206;
  fVar179 = auVar42._4_4_;
  auVar141._4_4_ = fVar179 * fVar189;
  auVar141._8_4_ = fVar180 * fVar200;
  auVar141._12_4_ = fVar179 * fVar202;
  fVar153 = auVar43._0_4_;
  auVar148._0_4_ = fVar153 * fVar206;
  fVar161 = auVar43._4_4_;
  auVar148._4_4_ = fVar161 * fVar189;
  auVar148._8_4_ = fVar153 * fVar200;
  auVar148._12_4_ = fVar161 * fVar202;
  fVar199 = auVar44._0_4_;
  auVar117._0_4_ = fVar199 * fVar206;
  fVar201 = auVar44._4_4_;
  auVar117._4_4_ = fVar201 * fVar189;
  auVar117._8_4_ = fVar199 * fVar200;
  auVar117._12_4_ = fVar201 * fVar202;
  auVar40 = vfmadd231ps_avx512vl(auVar132,auVar237,auVar38);
  auVar45 = vfmadd231ps_avx512vl(auVar141,auVar237,auVar46);
  auVar36 = vfmadd231ps_fma(auVar148,auVar237,auVar164);
  auVar237 = vfmadd231ps_fma(auVar117,auVar170,auVar237);
  auVar62 = vmovshdup_avx(auVar37);
  fVar189 = auVar37._0_4_;
  fVar206 = (auVar62._0_4_ - fVar189) * 0.04761905;
  auVar77._4_4_ = fVar189;
  auVar77._0_4_ = fVar189;
  auVar77._8_4_ = fVar189;
  auVar77._12_4_ = fVar189;
  auVar77._16_4_ = fVar189;
  auVar77._20_4_ = fVar189;
  auVar77._24_4_ = fVar189;
  auVar77._28_4_ = fVar189;
  auVar67._0_8_ = auVar62._0_8_;
  auVar67._8_8_ = auVar67._0_8_;
  auVar67._16_8_ = auVar67._0_8_;
  auVar67._24_8_ = auVar67._0_8_;
  auVar80 = vsubps_avx(auVar67,auVar77);
  uVar95 = auVar40._0_4_;
  auVar81._4_4_ = uVar95;
  auVar81._0_4_ = uVar95;
  auVar81._8_4_ = uVar95;
  auVar81._12_4_ = uVar95;
  auVar81._16_4_ = uVar95;
  auVar81._20_4_ = uVar95;
  auVar81._24_4_ = uVar95;
  auVar81._28_4_ = uVar95;
  auVar69._8_4_ = 1;
  auVar69._0_8_ = 0x100000001;
  auVar69._12_4_ = 1;
  auVar69._16_4_ = 1;
  auVar69._20_4_ = 1;
  auVar69._24_4_ = 1;
  auVar69._28_4_ = 1;
  auVar79 = ZEXT1632(auVar40);
  auVar78 = vpermps_avx2(auVar69,auVar79);
  auVar63 = vbroadcastss_avx512vl(auVar45);
  auVar73 = ZEXT1632(auVar45);
  auVar64 = vpermps_avx512vl(auVar69,auVar73);
  auVar65 = vbroadcastss_avx512vl(auVar36);
  auVar74 = ZEXT1632(auVar36);
  auVar66 = vpermps_avx512vl(auVar69,auVar74);
  auVar67 = vbroadcastss_avx512vl(auVar237);
  auVar76 = ZEXT1632(auVar237);
  auVar68 = vpermps_avx512vl(auVar69,auVar76);
  auVar82._4_4_ = fVar206;
  auVar82._0_4_ = fVar206;
  auVar82._8_4_ = fVar206;
  auVar82._12_4_ = fVar206;
  auVar82._16_4_ = fVar206;
  auVar82._20_4_ = fVar206;
  auVar82._24_4_ = fVar206;
  auVar82._28_4_ = fVar206;
  auVar75._8_4_ = 2;
  auVar75._0_8_ = 0x200000002;
  auVar75._12_4_ = 2;
  auVar75._16_4_ = 2;
  auVar75._20_4_ = 2;
  auVar75._24_4_ = 2;
  auVar75._28_4_ = 2;
  auVar69 = vpermps_avx512vl(auVar75,auVar79);
  auVar70 = vbroadcastss_avx512vl(ZEXT416(3));
  auVar71 = vpermps_avx512vl(auVar70,auVar79);
  auVar72 = vpermps_avx512vl(auVar75,auVar73);
  auVar73 = vpermps_avx512vl(auVar70,auVar73);
  auVar79 = vpermps_avx2(auVar75,auVar74);
  auVar74 = vpermps_avx512vl(auVar70,auVar74);
  auVar75 = vpermps_avx512vl(auVar75,auVar76);
  auVar70 = vpermps_avx512vl(auVar70,auVar76);
  auVar62 = vfmadd132ps_fma(auVar80,auVar77,_DAT_01f7b040);
  auVar80 = vsubps_avx(auVar83,ZEXT1632(auVar62));
  auVar76 = vmulps_avx512vl(auVar63,ZEXT1632(auVar62));
  auVar83 = ZEXT1632(auVar62);
  auVar77 = vmulps_avx512vl(auVar64,auVar83);
  auVar237 = vfmadd231ps_fma(auVar76,auVar80,auVar81);
  auVar36 = vfmadd231ps_fma(auVar77,auVar80,auVar78);
  auVar76 = vmulps_avx512vl(auVar65,auVar83);
  auVar77 = vmulps_avx512vl(auVar66,auVar83);
  auVar76 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar63);
  auVar77 = vfmadd231ps_avx512vl(auVar77,auVar80,auVar64);
  auVar63 = vmulps_avx512vl(auVar67,auVar83);
  auVar81 = ZEXT1632(auVar62);
  auVar64 = vmulps_avx512vl(auVar68,auVar81);
  auVar65 = vfmadd231ps_avx512vl(auVar63,auVar80,auVar65);
  auVar66 = vfmadd231ps_avx512vl(auVar64,auVar80,auVar66);
  fVar200 = auVar62._0_4_;
  fVar202 = auVar62._4_4_;
  auVar63._4_4_ = fVar202 * auVar76._4_4_;
  auVar63._0_4_ = fVar200 * auVar76._0_4_;
  fVar204 = auVar62._8_4_;
  auVar63._8_4_ = fVar204 * auVar76._8_4_;
  fVar205 = auVar62._12_4_;
  auVar63._12_4_ = fVar205 * auVar76._12_4_;
  auVar63._16_4_ = auVar76._16_4_ * 0.0;
  auVar63._20_4_ = auVar76._20_4_ * 0.0;
  auVar63._24_4_ = auVar76._24_4_ * 0.0;
  auVar63._28_4_ = fVar189;
  auVar64._4_4_ = fVar202 * auVar77._4_4_;
  auVar64._0_4_ = fVar200 * auVar77._0_4_;
  auVar64._8_4_ = fVar204 * auVar77._8_4_;
  auVar64._12_4_ = fVar205 * auVar77._12_4_;
  auVar64._16_4_ = auVar77._16_4_ * 0.0;
  auVar64._20_4_ = auVar77._20_4_ * 0.0;
  auVar64._24_4_ = auVar77._24_4_ * 0.0;
  auVar64._28_4_ = auVar78._28_4_;
  auVar237 = vfmadd231ps_fma(auVar63,auVar80,ZEXT1632(auVar237));
  auVar36 = vfmadd231ps_fma(auVar64,auVar80,ZEXT1632(auVar36));
  auVar68._0_4_ = fVar200 * auVar65._0_4_;
  auVar68._4_4_ = fVar202 * auVar65._4_4_;
  auVar68._8_4_ = fVar204 * auVar65._8_4_;
  auVar68._12_4_ = fVar205 * auVar65._12_4_;
  auVar68._16_4_ = auVar65._16_4_ * 0.0;
  auVar68._20_4_ = auVar65._20_4_ * 0.0;
  auVar68._24_4_ = auVar65._24_4_ * 0.0;
  auVar68._28_4_ = 0;
  auVar78._4_4_ = fVar202 * auVar66._4_4_;
  auVar78._0_4_ = fVar200 * auVar66._0_4_;
  auVar78._8_4_ = fVar204 * auVar66._8_4_;
  auVar78._12_4_ = fVar205 * auVar66._12_4_;
  auVar78._16_4_ = auVar66._16_4_ * 0.0;
  auVar78._20_4_ = auVar66._20_4_ * 0.0;
  auVar78._24_4_ = auVar66._24_4_ * 0.0;
  auVar78._28_4_ = auVar65._28_4_;
  auVar40 = vfmadd231ps_fma(auVar68,auVar80,auVar76);
  auVar45 = vfmadd231ps_fma(auVar78,auVar80,auVar77);
  auVar65._28_4_ = auVar77._28_4_;
  auVar65._0_28_ =
       ZEXT1628(CONCAT412(fVar205 * auVar45._12_4_,
                          CONCAT48(fVar204 * auVar45._8_4_,
                                   CONCAT44(fVar202 * auVar45._4_4_,fVar200 * auVar45._0_4_))));
  auVar47 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar205 * auVar40._12_4_,
                                               CONCAT48(fVar204 * auVar40._8_4_,
                                                        CONCAT44(fVar202 * auVar40._4_4_,
                                                                 fVar200 * auVar40._0_4_)))),auVar80
                            ,ZEXT1632(auVar237));
  auVar55 = vfmadd231ps_fma(auVar65,auVar80,ZEXT1632(auVar36));
  auVar78 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar237));
  auVar63 = vsubps_avx(ZEXT1632(auVar45),ZEXT1632(auVar36));
  auVar64 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar78 = vmulps_avx512vl(auVar78,auVar64);
  auVar63 = vmulps_avx512vl(auVar63,auVar64);
  auVar76._0_4_ = fVar206 * auVar78._0_4_;
  auVar76._4_4_ = fVar206 * auVar78._4_4_;
  auVar76._8_4_ = fVar206 * auVar78._8_4_;
  auVar76._12_4_ = fVar206 * auVar78._12_4_;
  auVar76._16_4_ = fVar206 * auVar78._16_4_;
  auVar76._20_4_ = fVar206 * auVar78._20_4_;
  auVar76._24_4_ = fVar206 * auVar78._24_4_;
  auVar76._28_4_ = 0;
  auVar78 = vmulps_avx512vl(auVar82,auVar63);
  auVar36 = vxorps_avx512vl(auVar67._0_16_,auVar67._0_16_);
  auVar63 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar65 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar122._0_4_ = auVar76._0_4_ + auVar47._0_4_;
  auVar122._4_4_ = auVar76._4_4_ + auVar47._4_4_;
  auVar122._8_4_ = auVar76._8_4_ + auVar47._8_4_;
  auVar122._12_4_ = auVar76._12_4_ + auVar47._12_4_;
  auVar122._16_4_ = auVar76._16_4_ + 0.0;
  auVar122._20_4_ = auVar76._20_4_ + 0.0;
  auVar122._24_4_ = auVar76._24_4_ + 0.0;
  auVar122._28_4_ = 0;
  auVar77 = ZEXT1632(auVar36);
  auVar66 = vpermt2ps_avx512vl(auVar76,_DAT_01fb9fc0,auVar77);
  auVar67 = vaddps_avx512vl(ZEXT1632(auVar55),auVar78);
  auVar68 = vpermt2ps_avx512vl(auVar78,_DAT_01fb9fc0,auVar77);
  auVar78 = vsubps_avx(auVar63,auVar66);
  auVar68 = vsubps_avx512vl(auVar65,auVar68);
  auVar66 = vmulps_avx512vl(auVar72,auVar81);
  auVar76 = vmulps_avx512vl(auVar73,auVar81);
  auVar66 = vfmadd231ps_avx512vl(auVar66,auVar80,auVar69);
  auVar69 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar71);
  auVar71 = vmulps_avx512vl(auVar79,auVar81);
  auVar76 = vmulps_avx512vl(auVar74,auVar81);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar80,auVar72);
  auVar72 = vfmadd231ps_avx512vl(auVar76,auVar80,auVar73);
  auVar73 = vmulps_avx512vl(auVar75,auVar81);
  auVar70 = vmulps_avx512vl(auVar70,auVar81);
  auVar237 = vfmadd231ps_fma(auVar73,auVar80,auVar79);
  auVar79 = vfmadd231ps_avx512vl(auVar70,auVar80,auVar74);
  auVar70 = vmulps_avx512vl(auVar81,auVar71);
  auVar75 = ZEXT1632(auVar62);
  auVar73 = vmulps_avx512vl(auVar75,auVar72);
  auVar66 = vfmadd231ps_avx512vl(auVar70,auVar80,auVar66);
  auVar69 = vfmadd231ps_avx512vl(auVar73,auVar80,auVar69);
  auVar79 = vmulps_avx512vl(auVar75,auVar79);
  auVar70 = vfmadd231ps_avx512vl
                      (ZEXT1632(CONCAT412(fVar205 * auVar237._12_4_,
                                          CONCAT48(fVar204 * auVar237._8_4_,
                                                   CONCAT44(fVar202 * auVar237._4_4_,
                                                            fVar200 * auVar237._0_4_)))),auVar80,
                       auVar71);
  auVar71 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar72);
  auVar79._4_4_ = fVar202 * auVar70._4_4_;
  auVar79._0_4_ = fVar200 * auVar70._0_4_;
  auVar79._8_4_ = fVar204 * auVar70._8_4_;
  auVar79._12_4_ = fVar205 * auVar70._12_4_;
  auVar79._16_4_ = auVar70._16_4_ * 0.0;
  auVar79._20_4_ = auVar70._20_4_ * 0.0;
  auVar79._24_4_ = auVar70._24_4_ * 0.0;
  auVar79._28_4_ = auVar74._28_4_;
  auVar72 = vmulps_avx512vl(auVar75,auVar71);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar80,auVar66);
  auVar72 = vfmadd231ps_avx512vl(auVar72,auVar69,auVar80);
  auVar80 = vsubps_avx512vl(auVar70,auVar66);
  auVar66 = vsubps_avx512vl(auVar71,auVar69);
  auVar69 = vmulps_avx512vl(auVar80,auVar64);
  auVar64 = vmulps_avx512vl(auVar66,auVar64);
  fVar189 = fVar206 * auVar69._0_4_;
  fVar200 = fVar206 * auVar69._4_4_;
  auVar80._4_4_ = fVar200;
  auVar80._0_4_ = fVar189;
  fVar202 = fVar206 * auVar69._8_4_;
  auVar80._8_4_ = fVar202;
  fVar204 = fVar206 * auVar69._12_4_;
  auVar80._12_4_ = fVar204;
  fVar205 = fVar206 * auVar69._16_4_;
  auVar80._16_4_ = fVar205;
  fVar188 = fVar206 * auVar69._20_4_;
  auVar80._20_4_ = fVar188;
  fVar206 = fVar206 * auVar69._24_4_;
  auVar80._24_4_ = fVar206;
  auVar80._28_4_ = auVar69._28_4_;
  auVar64 = vmulps_avx512vl(auVar82,auVar64);
  auVar70 = vpermt2ps_avx512vl(auVar79,_DAT_01fb9fc0,auVar77);
  auVar71 = vpermt2ps_avx512vl(auVar72,_DAT_01fb9fc0,auVar77);
  auVar187._0_4_ = auVar79._0_4_ + fVar189;
  auVar187._4_4_ = auVar79._4_4_ + fVar200;
  auVar187._8_4_ = auVar79._8_4_ + fVar202;
  auVar187._12_4_ = auVar79._12_4_ + fVar204;
  auVar187._16_4_ = auVar79._16_4_ + fVar205;
  auVar187._20_4_ = auVar79._20_4_ + fVar188;
  auVar187._24_4_ = auVar79._24_4_ + fVar206;
  auVar187._28_4_ = auVar79._28_4_ + auVar69._28_4_;
  auVar80 = vpermt2ps_avx512vl(auVar80,_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar69 = vaddps_avx512vl(auVar72,auVar64);
  auVar64 = vpermt2ps_avx512vl(auVar64,_DAT_01fb9fc0,ZEXT1632(auVar36));
  auVar80 = vsubps_avx(auVar70,auVar80);
  auVar64 = vsubps_avx512vl(auVar71,auVar64);
  auVar84 = ZEXT1632(auVar47);
  auVar66 = vsubps_avx512vl(auVar79,auVar84);
  auVar85 = ZEXT1632(auVar55);
  auVar73 = vsubps_avx512vl(auVar72,auVar85);
  auVar74 = vsubps_avx512vl(auVar70,auVar63);
  auVar66 = vaddps_avx512vl(auVar66,auVar74);
  auVar74 = vsubps_avx512vl(auVar71,auVar65);
  auVar73 = vaddps_avx512vl(auVar73,auVar74);
  auVar74 = vmulps_avx512vl(auVar85,auVar66);
  auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar84,auVar73);
  auVar75 = vmulps_avx512vl(auVar67,auVar66);
  auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar122,auVar73);
  auVar76 = vmulps_avx512vl(auVar68,auVar66);
  auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar78,auVar73);
  auVar77 = vmulps_avx512vl(auVar65,auVar66);
  auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar63,auVar73);
  auVar81 = vmulps_avx512vl(auVar72,auVar66);
  auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar79,auVar73);
  auVar82 = vmulps_avx512vl(auVar69,auVar66);
  auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar187,auVar73);
  auVar83 = vmulps_avx512vl(auVar64,auVar66);
  auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar80,auVar73);
  auVar66 = vmulps_avx512vl(auVar71,auVar66);
  auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar70,auVar73);
  auVar73 = vminps_avx512vl(auVar74,auVar75);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar76,auVar77);
  auVar73 = vminps_avx512vl(auVar73,auVar75);
  auVar75 = vmaxps_avx512vl(auVar76,auVar77);
  auVar74 = vmaxps_avx512vl(auVar74,auVar75);
  auVar75 = vminps_avx512vl(auVar81,auVar82);
  auVar76 = vmaxps_avx512vl(auVar81,auVar82);
  auVar77 = vminps_avx512vl(auVar83,auVar66);
  auVar75 = vminps_avx512vl(auVar75,auVar77);
  auVar73 = vminps_avx512vl(auVar73,auVar75);
  auVar66 = vmaxps_avx512vl(auVar83,auVar66);
  auVar66 = vmaxps_avx512vl(auVar76,auVar66);
  auVar74 = vmaxps_avx512vl(auVar74,auVar66);
  uVar16 = vcmpps_avx512vl(auVar73,local_260,2);
  auVar66._4_4_ = uStack_1bc;
  auVar66._0_4_ = local_1c0;
  auVar66._8_4_ = uStack_1b8;
  auVar66._12_4_ = uStack_1b4;
  auVar66._16_4_ = uStack_1b0;
  auVar66._20_4_ = uStack_1ac;
  auVar66._24_4_ = uStack_1a8;
  auVar66._28_4_ = uStack_1a4;
  uVar17 = vcmpps_avx512vl(auVar74,auVar66,5);
  bVar22 = (byte)uVar16 & (byte)uVar17 & 0x7f;
  if (bVar22 != 0) {
    auVar73 = vsubps_avx512vl(auVar63,auVar84);
    auVar74 = vsubps_avx512vl(auVar65,auVar85);
    auVar75 = vsubps_avx512vl(auVar70,auVar79);
    auVar73 = vaddps_avx512vl(auVar73,auVar75);
    auVar75 = vsubps_avx512vl(auVar71,auVar72);
    auVar74 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vmulps_avx512vl(auVar85,auVar73);
    auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar74,auVar84);
    auVar67 = vmulps_avx512vl(auVar67,auVar73);
    auVar67 = vfnmadd213ps_avx512vl(auVar122,auVar74,auVar67);
    auVar68 = vmulps_avx512vl(auVar68,auVar73);
    auVar68 = vfnmadd213ps_avx512vl(auVar78,auVar74,auVar68);
    auVar78 = vmulps_avx512vl(auVar65,auVar73);
    auVar65 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar63);
    auVar78 = vmulps_avx512vl(auVar72,auVar73);
    auVar72 = vfnmadd231ps_avx512vl(auVar78,auVar74,auVar79);
    auVar78 = vmulps_avx512vl(auVar69,auVar73);
    auVar69 = vfnmadd213ps_avx512vl(auVar187,auVar74,auVar78);
    auVar78 = vmulps_avx512vl(auVar64,auVar73);
    auVar76 = vfnmadd213ps_avx512vl(auVar80,auVar74,auVar78);
    auVar80 = vmulps_avx512vl(auVar71,auVar73);
    auVar70 = vfnmadd231ps_avx512vl(auVar80,auVar70,auVar74);
    auVar78 = vminps_avx(auVar75,auVar67);
    auVar80 = vmaxps_avx(auVar75,auVar67);
    auVar63 = vminps_avx(auVar68,auVar65);
    auVar63 = vminps_avx(auVar78,auVar63);
    auVar78 = vmaxps_avx(auVar68,auVar65);
    auVar80 = vmaxps_avx(auVar80,auVar78);
    auVar79 = vminps_avx(auVar72,auVar69);
    auVar78 = vmaxps_avx(auVar72,auVar69);
    auVar64 = vminps_avx(auVar76,auVar70);
    auVar79 = vminps_avx(auVar79,auVar64);
    auVar79 = vminps_avx(auVar63,auVar79);
    auVar63 = vmaxps_avx(auVar76,auVar70);
    auVar78 = vmaxps_avx(auVar78,auVar63);
    auVar80 = vmaxps_avx(auVar80,auVar78);
    uVar16 = vcmpps_avx512vl(auVar80,auVar66,5);
    uVar17 = vcmpps_avx512vl(auVar79,local_260,2);
    bVar22 = bVar22 & (byte)uVar16 & (byte)uVar17;
    if (bVar22 != 0) {
      auStack_460[uVar24] = (uint)bVar22;
      uVar16 = vmovlps_avx(auVar37);
      (&uStack_240)[uVar24] = uVar16;
      uVar2 = vmovlps_avx(auVar60);
      auStack_1a0[uVar24] = uVar2;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
  }
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar231 = ZEXT1664(auVar37);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar232 = ZEXT1664(auVar37);
  auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar233 = ZEXT3264(auVar80);
  auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
  auVar234 = ZEXT1664(auVar37);
  auVar235 = ZEXT3264(_DAT_01fb9fe0);
LAB_017e22a6:
  do {
    do {
      do {
        auVar237 = auVar238._0_16_;
        auVar62 = auVar231._0_16_;
        if ((int)uVar24 == 0) {
          if (bVar11) goto LAB_017e31c2;
          uVar95 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar21._4_4_ = uVar95;
          auVar21._0_4_ = uVar95;
          auVar21._8_4_ = uVar95;
          auVar21._12_4_ = uVar95;
          uVar16 = vcmpps_avx512vl(local_3c0,auVar21,2);
          uVar29 = (ulong)((uint)uVar29 & (uint)uVar29 + 0xf & (uint)uVar16);
          goto LAB_017e169d;
        }
        uVar23 = (int)uVar24 - 1;
        uVar25 = (ulong)uVar23;
        uVar6 = auStack_460[uVar25];
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auStack_1a0[uVar25];
        uVar2 = 0;
        for (uVar28 = (ulong)uVar6; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
          uVar2 = uVar2 + 1;
        }
        uVar27 = uVar6 - 1 & uVar6;
        bVar32 = uVar27 == 0;
        auStack_460[uVar25] = uVar27;
        if (bVar32) {
          uVar24 = (ulong)uVar23;
        }
        auVar100._8_8_ = 0;
        auVar100._0_8_ = uVar2;
        auVar37 = vpunpcklqdq_avx(auVar100,ZEXT416((int)uVar2 + 1));
        auVar37 = vcvtqq2ps_avx512vl(auVar37);
        auVar37 = vmulps_avx512vl(auVar37,auVar234._0_16_);
        uVar95 = *(undefined4 *)((long)&uStack_240 + uVar25 * 8 + 4);
        auVar18._4_4_ = uVar95;
        auVar18._0_4_ = uVar95;
        auVar18._8_4_ = uVar95;
        auVar18._12_4_ = uVar95;
        auVar36 = vmulps_avx512vl(auVar37,auVar18);
        auVar37 = vsubps_avx512vl(auVar237,auVar37);
        uVar95 = *(undefined4 *)(&uStack_240 + uVar25);
        auVar19._4_4_ = uVar95;
        auVar19._0_4_ = uVar95;
        auVar19._8_4_ = uVar95;
        auVar19._12_4_ = uVar95;
        auVar37 = vfmadd231ps_avx512vl(auVar36,auVar37,auVar19);
        auVar36 = vmovshdup_avx(auVar37);
        fVar206 = auVar36._0_4_ - auVar37._0_4_;
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        if (uVar6 == 0 || bVar32) goto LAB_017e1da0;
        auVar36 = vshufps_avx(auVar60,auVar60,0x50);
        vucomiss_avx512f(ZEXT416((uint)fVar206));
        auVar47 = vsubps_avx512vl(auVar237,auVar36);
        fVar189 = auVar36._0_4_;
        auVar142._0_4_ = fVar189 * fVar123;
        fVar200 = auVar36._4_4_;
        auVar142._4_4_ = fVar200 * fVar136;
        fVar202 = auVar36._8_4_;
        auVar142._8_4_ = fVar202 * fVar123;
        fVar204 = auVar36._12_4_;
        auVar142._12_4_ = fVar204 * fVar136;
        auVar149._0_4_ = fVar189 * fVar180;
        auVar149._4_4_ = fVar200 * fVar179;
        auVar149._8_4_ = fVar202 * fVar180;
        auVar149._12_4_ = fVar204 * fVar179;
        auVar155._0_4_ = fVar189 * fVar153;
        auVar155._4_4_ = fVar200 * fVar161;
        auVar155._8_4_ = fVar202 * fVar153;
        auVar155._12_4_ = fVar204 * fVar161;
        auVar124._0_4_ = fVar189 * fVar199;
        auVar124._4_4_ = fVar200 * fVar201;
        auVar124._8_4_ = fVar202 * fVar199;
        auVar124._12_4_ = fVar204 * fVar201;
        auVar36 = vfmadd231ps_fma(auVar142,auVar47,auVar38);
        auVar40 = vfmadd231ps_fma(auVar149,auVar47,auVar46);
        auVar45 = vfmadd231ps_fma(auVar155,auVar47,auVar164);
        auVar47 = vfmadd231ps_fma(auVar124,auVar47,auVar170);
        auVar71._16_16_ = auVar36;
        auVar71._0_16_ = auVar36;
        auVar72._16_16_ = auVar40;
        auVar72._0_16_ = auVar40;
        auVar74._16_16_ = auVar45;
        auVar74._0_16_ = auVar45;
        auVar78 = vpermps_avx512vl(auVar235._0_32_,ZEXT1632(auVar37));
        auVar80 = vsubps_avx(auVar72,auVar71);
        auVar40 = vfmadd213ps_fma(auVar80,auVar78,auVar71);
        auVar80 = vsubps_avx(auVar74,auVar72);
        auVar55 = vfmadd213ps_fma(auVar80,auVar78,auVar72);
        auVar36 = vsubps_avx(auVar47,auVar45);
        auVar73._16_16_ = auVar36;
        auVar73._0_16_ = auVar36;
        auVar36 = vfmadd213ps_fma(auVar73,auVar78,auVar74);
        auVar80 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar40));
        auVar40 = vfmadd213ps_fma(auVar80,auVar78,ZEXT1632(auVar40));
        auVar80 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar55));
        auVar36 = vfmadd213ps_fma(auVar80,auVar78,ZEXT1632(auVar55));
        auVar80 = vsubps_avx(ZEXT1632(auVar36),ZEXT1632(auVar40));
        auVar61 = vfmadd231ps_fma(ZEXT1632(auVar40),auVar80,auVar78);
        auVar80 = vmulps_avx512vl(auVar80,auVar233._0_32_);
        auVar70._16_16_ = auVar80._16_16_;
        auVar36 = vmulss_avx512f(ZEXT416((uint)fVar206),SUB6416(ZEXT464(0x3eaaaaab),0));
        fVar189 = auVar36._0_4_;
        auVar156._0_8_ =
             CONCAT44(auVar61._4_4_ + fVar189 * auVar80._4_4_,
                      auVar61._0_4_ + fVar189 * auVar80._0_4_);
        auVar156._8_4_ = auVar61._8_4_ + fVar189 * auVar80._8_4_;
        auVar156._12_4_ = auVar61._12_4_ + fVar189 * auVar80._12_4_;
        auVar143._0_4_ = fVar189 * auVar80._16_4_;
        auVar143._4_4_ = fVar189 * auVar80._20_4_;
        auVar143._8_4_ = fVar189 * auVar80._24_4_;
        auVar143._12_4_ = fVar189 * auVar80._28_4_;
        auVar54 = vsubps_avx((undefined1  [16])0x0,auVar143);
        auVar55 = vshufpd_avx(auVar61,auVar61,3);
        auVar58 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        auVar36 = vsubps_avx(auVar55,auVar61);
        auVar40 = vsubps_avx(auVar58,(undefined1  [16])0x0);
        auVar171._0_4_ = auVar36._0_4_ + auVar40._0_4_;
        auVar171._4_4_ = auVar36._4_4_ + auVar40._4_4_;
        auVar171._8_4_ = auVar36._8_4_ + auVar40._8_4_;
        auVar171._12_4_ = auVar36._12_4_ + auVar40._12_4_;
        auVar36 = vshufps_avx(auVar61,auVar61,0xb1);
        auVar40 = vshufps_avx(auVar156,auVar156,0xb1);
        auVar45 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar47 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar224._4_4_ = auVar171._0_4_;
        auVar224._0_4_ = auVar171._0_4_;
        auVar224._8_4_ = auVar171._0_4_;
        auVar224._12_4_ = auVar171._0_4_;
        auVar50 = vshufps_avx(auVar171,auVar171,0x55);
        fVar189 = auVar50._0_4_;
        auVar185._0_4_ = auVar36._0_4_ * fVar189;
        fVar200 = auVar50._4_4_;
        auVar185._4_4_ = auVar36._4_4_ * fVar200;
        fVar202 = auVar50._8_4_;
        auVar185._8_4_ = auVar36._8_4_ * fVar202;
        fVar204 = auVar50._12_4_;
        auVar185._12_4_ = auVar36._12_4_ * fVar204;
        auVar191._0_4_ = auVar40._0_4_ * fVar189;
        auVar191._4_4_ = auVar40._4_4_ * fVar200;
        auVar191._8_4_ = auVar40._8_4_ * fVar202;
        auVar191._12_4_ = auVar40._12_4_ * fVar204;
        auVar210._0_4_ = auVar45._0_4_ * fVar189;
        auVar210._4_4_ = auVar45._4_4_ * fVar200;
        auVar210._8_4_ = auVar45._8_4_ * fVar202;
        auVar210._12_4_ = auVar45._12_4_ * fVar204;
        auVar172._0_4_ = auVar47._0_4_ * fVar189;
        auVar172._4_4_ = auVar47._4_4_ * fVar200;
        auVar172._8_4_ = auVar47._8_4_ * fVar202;
        auVar172._12_4_ = auVar47._12_4_ * fVar204;
        auVar36 = vfmadd231ps_fma(auVar185,auVar224,auVar61);
        auVar40 = vfmadd231ps_fma(auVar191,auVar224,auVar156);
        auVar52 = vfmadd231ps_fma(auVar210,auVar224,auVar54);
        auVar53 = vfmadd231ps_fma(auVar172,(undefined1  [16])0x0,auVar224);
        auVar50 = vshufpd_avx(auVar36,auVar36,1);
        auVar51 = vshufpd_avx(auVar40,auVar40,1);
        auVar48 = vshufpd_avx512vl(auVar52,auVar52,1);
        auVar49 = vshufpd_avx512vl(auVar53,auVar53,1);
        auVar45 = vminss_avx(auVar36,auVar40);
        auVar36 = vmaxss_avx(auVar40,auVar36);
        auVar47 = vminss_avx(auVar52,auVar53);
        auVar40 = vmaxss_avx(auVar53,auVar52);
        auVar45 = vminss_avx(auVar45,auVar47);
        auVar36 = vmaxss_avx(auVar40,auVar36);
        auVar47 = vminss_avx(auVar50,auVar51);
        auVar40 = vmaxss_avx(auVar51,auVar50);
        auVar50 = vminss_avx512f(auVar48,auVar49);
        auVar51 = vmaxss_avx512f(auVar49,auVar48);
        auVar40 = vmaxss_avx(auVar51,auVar40);
        auVar47 = vminss_avx512f(auVar47,auVar50);
        vucomiss_avx512f(auVar45);
        fVar200 = auVar40._0_4_;
        fVar189 = auVar36._0_4_;
        if (4 < (uint)uVar24) {
          bVar33 = fVar200 == -0.0001;
          bVar30 = NAN(fVar200);
          if (fVar200 <= -0.0001) goto LAB_017e24c7;
          break;
        }
LAB_017e24c7:
        auVar50 = vucomiss_avx512f(auVar47);
        bVar33 = fVar200 <= -0.0001;
        bVar31 = -0.0001 < fVar189;
        bVar30 = bVar33;
        if (!bVar33) break;
        uVar16 = vcmpps_avx512vl(auVar45,auVar50,5);
        uVar17 = vcmpps_avx512vl(auVar47,auVar50,5);
        bVar22 = (byte)uVar16 & (byte)uVar17;
        bVar12 = (bVar22 & 1) == 0;
        bVar33 = bVar31 && bVar12;
        bVar30 = bVar31 && (bVar22 & 1) == 0;
      } while (!bVar31 || !bVar12);
      auVar52 = auVar239._0_16_;
      vcmpss_avx512f(auVar45,auVar52,1);
      uVar16 = vcmpss_avx512f(auVar36,auVar52,1);
      bVar31 = (bool)((byte)uVar16 & 1);
      auVar70._0_16_ = auVar240._0_16_;
      auVar84._4_28_ = auVar70._4_28_;
      auVar84._0_4_ = (float)((uint)bVar31 * -0x40800000 + (uint)!bVar31 * auVar240._0_4_);
      vucomiss_avx512f(auVar84._0_16_);
      bVar30 = (bool)(!bVar33 | bVar30);
      bVar31 = bVar30 == false;
      auVar86._16_16_ = auVar70._16_16_;
      auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
      auVar85._4_28_ = auVar86._4_28_;
      auVar85._0_4_ = (uint)bVar30 * auVar239._0_4_ + (uint)!bVar30 * 0x7f800000;
      auVar51 = auVar85._0_16_;
      auVar88._16_16_ = auVar70._16_16_;
      auVar88._0_16_ = SUB6416(ZEXT464(0xff800000),0);
      auVar87._4_28_ = auVar88._4_28_;
      auVar87._0_4_ = (uint)bVar30 * auVar239._0_4_ + (uint)!bVar30 * -0x800000;
      auVar50 = auVar87._0_16_;
      uVar16 = vcmpss_avx512f(auVar47,auVar52,1);
      bVar33 = (bool)((byte)uVar16 & 1);
      auVar90._16_16_ = auVar70._16_16_;
      auVar90._0_16_ = auVar240._0_16_;
      auVar89._4_28_ = auVar90._4_28_;
      auVar89._0_4_ = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * auVar240._0_4_);
      vucomiss_avx512f(auVar89._0_16_);
      if ((bVar30) || (bVar31)) {
        auVar47 = vucomiss_avx512f(auVar45);
        if ((bVar30) || (bVar31)) {
          auVar53 = vxorps_avx512vl(auVar45,auVar232._0_16_);
          auVar45 = vsubss_avx512f(auVar47,auVar45);
          auVar45 = vdivss_avx512f(auVar53,auVar45);
          auVar47 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
          auVar47 = vfmadd213ss_avx512f(auVar47,auVar52,auVar45);
          auVar45 = auVar47;
        }
        else {
          auVar45 = vxorps_avx512vl(auVar47,auVar47);
          vucomiss_avx512f(auVar45);
          auVar47 = ZEXT416(0x3f800000);
          if ((bVar30) || (bVar31)) {
            auVar47 = SUB6416(ZEXT464(0xff800000),0);
            auVar45 = SUB6416(ZEXT464(0x7f800000),0);
          }
        }
        auVar51 = vminss_avx512f(auVar51,auVar45);
        auVar50 = vmaxss_avx(auVar47,auVar50);
      }
      auVar240 = ZEXT464(0x3f800000);
      uVar16 = vcmpss_avx512f(auVar40,auVar52,1);
      bVar33 = (bool)((byte)uVar16 & 1);
      auVar40 = auVar240._0_16_;
      fVar202 = (float)((uint)bVar33 * -0x40800000 + (uint)!bVar33 * 0x3f800000);
      if ((auVar84._0_4_ != fVar202) || (NAN(auVar84._0_4_) || NAN(fVar202))) {
        if ((fVar200 != fVar189) || (NAN(fVar200) || NAN(fVar189))) {
          auVar36 = vxorps_avx512vl(auVar36,auVar232._0_16_);
          auVar173._0_4_ = auVar36._0_4_ / (fVar200 - fVar189);
          auVar173._4_12_ = auVar36._4_12_;
          auVar36 = vsubss_avx512f(auVar40,auVar173);
          auVar36 = vfmadd213ss_avx512f(auVar36,auVar52,auVar173);
          auVar45 = auVar36;
        }
        else if ((fVar189 != 0.0) ||
                (auVar36 = auVar40, auVar45 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar189))) {
          auVar36 = SUB6416(ZEXT464(0xff800000),0);
          auVar45 = SUB6416(ZEXT464(0x7f800000),0);
        }
        auVar51 = vminss_avx(auVar51,auVar45);
        auVar50 = vmaxss_avx(auVar36,auVar50);
      }
      bVar33 = auVar89._0_4_ != fVar202;
      auVar36 = vminss_avx512f(auVar51,auVar40);
      auVar92._16_16_ = auVar70._16_16_;
      auVar92._0_16_ = auVar51;
      auVar91._4_28_ = auVar92._4_28_;
      auVar91._0_4_ = (uint)bVar33 * auVar36._0_4_ + (uint)!bVar33 * auVar51._0_4_;
      auVar36 = vmaxss_avx512f(auVar40,auVar50);
      auVar94._16_16_ = auVar70._16_16_;
      auVar94._0_16_ = auVar50;
      auVar93._4_28_ = auVar94._4_28_;
      auVar93._0_4_ = (uint)bVar33 * auVar36._0_4_ + (uint)!bVar33 * auVar50._0_4_;
      auVar36 = vmaxss_avx512f(auVar52,auVar91._0_16_);
      auVar45 = vminss_avx512f(auVar93._0_16_,auVar40);
    } while (auVar45._0_4_ < auVar36._0_4_);
    auVar52 = vmaxss_avx512f(auVar52,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
    auVar53 = vminss_avx512f(ZEXT416((uint)(auVar45._0_4_ + 0.1)),auVar40);
    auVar125._0_8_ = auVar61._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar192._8_8_ = auVar156._0_8_;
    auVar192._0_8_ = auVar156._0_8_;
    auVar211._8_8_ = auVar54._0_8_;
    auVar211._0_8_ = auVar54._0_8_;
    auVar36 = vshufpd_avx(auVar156,auVar156,3);
    auVar45 = vshufpd_avx(auVar54,auVar54,3);
    auVar47 = vshufps_avx(auVar52,auVar53,0);
    auVar54 = vsubps_avx512vl(auVar237,auVar47);
    fVar189 = auVar47._0_4_;
    auVar150._0_4_ = fVar189 * auVar55._0_4_;
    fVar200 = auVar47._4_4_;
    auVar150._4_4_ = fVar200 * auVar55._4_4_;
    fVar202 = auVar47._8_4_;
    auVar150._8_4_ = fVar202 * auVar55._8_4_;
    fVar204 = auVar47._12_4_;
    auVar150._12_4_ = fVar204 * auVar55._12_4_;
    auVar157._0_4_ = fVar189 * auVar36._0_4_;
    auVar157._4_4_ = fVar200 * auVar36._4_4_;
    auVar157._8_4_ = fVar202 * auVar36._8_4_;
    auVar157._12_4_ = fVar204 * auVar36._12_4_;
    auVar226._0_4_ = auVar45._0_4_ * fVar189;
    auVar226._4_4_ = auVar45._4_4_ * fVar200;
    auVar226._8_4_ = auVar45._8_4_ * fVar202;
    auVar226._12_4_ = auVar45._12_4_ * fVar204;
    auVar144._0_4_ = fVar189 * auVar58._0_4_;
    auVar144._4_4_ = fVar200 * auVar58._4_4_;
    auVar144._8_4_ = fVar202 * auVar58._8_4_;
    auVar144._12_4_ = fVar204 * auVar58._12_4_;
    auVar58 = vfmadd231ps_fma(auVar150,auVar54,auVar125);
    auVar50 = vfmadd231ps_fma(auVar157,auVar54,auVar192);
    auVar51 = vfmadd231ps_fma(auVar226,auVar54,auVar211);
    auVar54 = vfmadd231ps_fma(auVar144,auVar54,ZEXT816(0));
    auVar45 = vsubss_avx512f(auVar40,auVar52);
    auVar36 = vmovshdup_avx(auVar60);
    auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar52._0_4_)),auVar60,auVar45);
    auVar45 = vsubss_avx512f(auVar40,auVar53);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar53._0_4_)),auVar60,auVar45);
    auVar52 = vdivss_avx512f(auVar40,ZEXT416((uint)fVar206));
    auVar36 = vsubps_avx(auVar50,auVar58);
    auVar47 = vmulps_avx512vl(auVar36,auVar62);
    auVar36 = vsubps_avx(auVar51,auVar50);
    auVar55 = vmulps_avx512vl(auVar36,auVar62);
    auVar36 = vsubps_avx(auVar54,auVar51);
    auVar36 = vmulps_avx512vl(auVar36,auVar62);
    auVar45 = vminps_avx(auVar55,auVar36);
    auVar36 = vmaxps_avx(auVar55,auVar36);
    auVar45 = vminps_avx(auVar47,auVar45);
    auVar36 = vmaxps_avx(auVar47,auVar36);
    auVar47 = vshufpd_avx(auVar45,auVar45,3);
    auVar55 = vshufpd_avx(auVar36,auVar36,3);
    auVar45 = vminps_avx(auVar45,auVar47);
    auVar36 = vmaxps_avx(auVar36,auVar55);
    fVar206 = auVar52._0_4_;
    auVar174._0_4_ = auVar45._0_4_ * fVar206;
    auVar174._4_4_ = auVar45._4_4_ * fVar206;
    auVar174._8_4_ = auVar45._8_4_ * fVar206;
    auVar174._12_4_ = auVar45._12_4_ * fVar206;
    auVar165._0_4_ = fVar206 * auVar36._0_4_;
    auVar165._4_4_ = fVar206 * auVar36._4_4_;
    auVar165._8_4_ = fVar206 * auVar36._8_4_;
    auVar165._12_4_ = fVar206 * auVar36._12_4_;
    auVar52 = vdivss_avx512f(auVar40,ZEXT416((uint)(auVar49._0_4_ - auVar48._0_4_)));
    auVar36 = vshufpd_avx(auVar58,auVar58,3);
    auVar45 = vshufpd_avx(auVar50,auVar50,3);
    auVar47 = vshufpd_avx(auVar51,auVar51,3);
    auVar55 = vshufpd_avx(auVar54,auVar54,3);
    auVar36 = vsubps_avx(auVar36,auVar58);
    auVar58 = vsubps_avx(auVar45,auVar50);
    auVar50 = vsubps_avx(auVar47,auVar51);
    auVar55 = vsubps_avx(auVar55,auVar54);
    auVar45 = vminps_avx(auVar36,auVar58);
    auVar36 = vmaxps_avx(auVar36,auVar58);
    auVar47 = vminps_avx(auVar50,auVar55);
    auVar47 = vminps_avx(auVar45,auVar47);
    auVar45 = vmaxps_avx(auVar50,auVar55);
    auVar36 = vmaxps_avx(auVar36,auVar45);
    fVar206 = auVar52._0_4_;
    auVar212._0_4_ = fVar206 * auVar47._0_4_;
    auVar212._4_4_ = fVar206 * auVar47._4_4_;
    auVar212._8_4_ = fVar206 * auVar47._8_4_;
    auVar212._12_4_ = fVar206 * auVar47._12_4_;
    auVar193._0_4_ = fVar206 * auVar36._0_4_;
    auVar193._4_4_ = fVar206 * auVar36._4_4_;
    auVar193._8_4_ = fVar206 * auVar36._8_4_;
    auVar193._12_4_ = fVar206 * auVar36._12_4_;
    auVar55 = vinsertps_avx(auVar37,auVar48,0x10);
    auVar56 = vpermt2ps_avx512vl(auVar37,_DAT_01fb9f90,auVar49);
    auVar106._0_4_ = auVar55._0_4_ + auVar56._0_4_;
    auVar106._4_4_ = auVar55._4_4_ + auVar56._4_4_;
    auVar106._8_4_ = auVar55._8_4_ + auVar56._8_4_;
    auVar106._12_4_ = auVar55._12_4_ + auVar56._12_4_;
    auVar20._8_4_ = 0x3f000000;
    auVar20._0_8_ = 0x3f0000003f000000;
    auVar20._12_4_ = 0x3f000000;
    auVar52 = vmulps_avx512vl(auVar106,auVar20);
    auVar45 = vshufps_avx(auVar52,auVar52,0x54);
    uVar95 = auVar52._0_4_;
    auVar118._4_4_ = uVar95;
    auVar118._0_4_ = uVar95;
    auVar118._8_4_ = uVar95;
    auVar118._12_4_ = uVar95;
    auVar47 = vfmadd213ps_fma(local_270,auVar118,auVar34);
    auVar58 = vfmadd213ps_fma(local_280,auVar118,auVar39);
    auVar50 = vfmadd213ps_fma(local_290,auVar118,auVar35);
    auVar36 = vsubps_avx(auVar58,auVar47);
    auVar47 = vfmadd213ps_fma(auVar36,auVar118,auVar47);
    auVar36 = vsubps_avx(auVar50,auVar58);
    auVar36 = vfmadd213ps_fma(auVar36,auVar118,auVar58);
    auVar36 = vsubps_avx(auVar36,auVar47);
    auVar47 = vfmadd231ps_fma(auVar47,auVar36,auVar118);
    auVar51 = vmulps_avx512vl(auVar36,auVar62);
    auVar220._8_8_ = auVar47._0_8_;
    auVar220._0_8_ = auVar47._0_8_;
    auVar36 = vshufpd_avx(auVar47,auVar47,3);
    auVar47 = vshufps_avx(auVar52,auVar52,0x55);
    auVar58 = vsubps_avx(auVar36,auVar220);
    auVar50 = vfmadd231ps_fma(auVar220,auVar47,auVar58);
    auVar227._8_8_ = auVar51._0_8_;
    auVar227._0_8_ = auVar51._0_8_;
    auVar36 = vshufpd_avx(auVar51,auVar51,3);
    auVar36 = vsubps_avx512vl(auVar36,auVar227);
    auVar36 = vfmadd213ps_avx512vl(auVar36,auVar47,auVar227);
    auVar119._0_8_ = auVar58._0_8_ ^ 0x8000000080000000;
    auVar119._8_4_ = auVar58._8_4_ ^ 0x80000000;
    auVar119._12_4_ = auVar58._12_4_ ^ 0x80000000;
    auVar47 = vmovshdup_avx512vl(auVar36);
    auVar228._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
    auVar228._8_4_ = auVar47._8_4_ ^ 0x80000000;
    auVar228._12_4_ = auVar47._12_4_ ^ 0x80000000;
    auVar51 = vmovshdup_avx512vl(auVar58);
    auVar54 = vpermt2ps_avx512vl(auVar228,ZEXT416(5),auVar58);
    auVar57 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
    auVar239 = ZEXT1664(auVar57);
    auVar47 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar58._0_4_)),auVar36,auVar51);
    auVar58 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar119);
    auVar145._0_4_ = auVar47._0_4_;
    auVar145._4_4_ = auVar145._0_4_;
    auVar145._8_4_ = auVar145._0_4_;
    auVar145._12_4_ = auVar145._0_4_;
    auVar36 = vdivps_avx(auVar54,auVar145);
    auVar59 = vdivps_avx512vl(auVar58,auVar145);
    fVar206 = auVar50._0_4_;
    auVar47 = vshufps_avx(auVar50,auVar50,0x55);
    auVar221._0_4_ = fVar206 * auVar36._0_4_ + auVar47._0_4_ * auVar59._0_4_;
    auVar221._4_4_ = fVar206 * auVar36._4_4_ + auVar47._4_4_ * auVar59._4_4_;
    auVar221._8_4_ = fVar206 * auVar36._8_4_ + auVar47._8_4_ * auVar59._8_4_;
    auVar221._12_4_ = fVar206 * auVar36._12_4_ + auVar47._12_4_ * auVar59._12_4_;
    auVar53 = vsubps_avx(auVar45,auVar221);
    auVar47 = vmovshdup_avx(auVar36);
    auVar45 = vinsertps_avx(auVar174,auVar212,0x1c);
    auVar229._0_4_ = auVar47._0_4_ * auVar45._0_4_;
    auVar229._4_4_ = auVar47._4_4_ * auVar45._4_4_;
    auVar229._8_4_ = auVar47._8_4_ * auVar45._8_4_;
    auVar229._12_4_ = auVar47._12_4_ * auVar45._12_4_;
    auVar61 = vinsertps_avx512f(auVar165,auVar193,0x1c);
    auVar47 = vmulps_avx512vl(auVar47,auVar61);
    auVar54 = vminps_avx512vl(auVar229,auVar47);
    auVar50 = vmaxps_avx(auVar47,auVar229);
    auVar51 = vmovshdup_avx(auVar59);
    auVar47 = vinsertps_avx(auVar212,auVar174,0x4c);
    auVar213._0_4_ = auVar51._0_4_ * auVar47._0_4_;
    auVar213._4_4_ = auVar51._4_4_ * auVar47._4_4_;
    auVar213._8_4_ = auVar51._8_4_ * auVar47._8_4_;
    auVar213._12_4_ = auVar51._12_4_ * auVar47._12_4_;
    auVar58 = vinsertps_avx(auVar193,auVar165,0x4c);
    auVar194._0_4_ = auVar51._0_4_ * auVar58._0_4_;
    auVar194._4_4_ = auVar51._4_4_ * auVar58._4_4_;
    auVar194._8_4_ = auVar51._8_4_ * auVar58._8_4_;
    auVar194._12_4_ = auVar51._12_4_ * auVar58._12_4_;
    auVar51 = vminps_avx(auVar213,auVar194);
    auVar54 = vaddps_avx512vl(auVar54,auVar51);
    auVar51 = vmaxps_avx(auVar194,auVar213);
    auVar195._0_4_ = auVar50._0_4_ + auVar51._0_4_;
    auVar195._4_4_ = auVar50._4_4_ + auVar51._4_4_;
    auVar195._8_4_ = auVar50._8_4_ + auVar51._8_4_;
    auVar195._12_4_ = auVar50._12_4_ + auVar51._12_4_;
    auVar214._8_8_ = 0x3f80000000000000;
    auVar214._0_8_ = 0x3f80000000000000;
    auVar50 = vsubps_avx(auVar214,auVar195);
    auVar51 = vsubps_avx(auVar214,auVar54);
    auVar54 = vsubps_avx(auVar55,auVar52);
    auVar52 = vsubps_avx(auVar56,auVar52);
    fVar204 = auVar54._0_4_;
    auVar230._0_4_ = fVar204 * auVar50._0_4_;
    fVar205 = auVar54._4_4_;
    auVar230._4_4_ = fVar205 * auVar50._4_4_;
    fVar188 = auVar54._8_4_;
    auVar230._8_4_ = fVar188 * auVar50._8_4_;
    fVar203 = auVar54._12_4_;
    auVar230._12_4_ = fVar203 * auVar50._12_4_;
    auVar60 = vbroadcastss_avx512vl(auVar36);
    auVar45 = vmulps_avx512vl(auVar60,auVar45);
    auVar61 = vmulps_avx512vl(auVar60,auVar61);
    auVar60 = vminps_avx512vl(auVar45,auVar61);
    auVar61 = vmaxps_avx512vl(auVar61,auVar45);
    auVar45 = vbroadcastss_avx512vl(auVar59);
    auVar47 = vmulps_avx512vl(auVar45,auVar47);
    auVar45 = vmulps_avx512vl(auVar45,auVar58);
    auVar58 = vminps_avx512vl(auVar47,auVar45);
    auVar58 = vaddps_avx512vl(auVar60,auVar58);
    auVar54 = vmulps_avx512vl(auVar54,auVar51);
    fVar206 = auVar52._0_4_;
    auVar196._0_4_ = fVar206 * auVar50._0_4_;
    fVar189 = auVar52._4_4_;
    auVar196._4_4_ = fVar189 * auVar50._4_4_;
    fVar200 = auVar52._8_4_;
    auVar196._8_4_ = fVar200 * auVar50._8_4_;
    fVar202 = auVar52._12_4_;
    auVar196._12_4_ = fVar202 * auVar50._12_4_;
    auVar215._0_4_ = fVar206 * auVar51._0_4_;
    auVar215._4_4_ = fVar189 * auVar51._4_4_;
    auVar215._8_4_ = fVar200 * auVar51._8_4_;
    auVar215._12_4_ = fVar202 * auVar51._12_4_;
    auVar45 = vmaxps_avx(auVar45,auVar47);
    auVar166._0_4_ = auVar61._0_4_ + auVar45._0_4_;
    auVar166._4_4_ = auVar61._4_4_ + auVar45._4_4_;
    auVar166._8_4_ = auVar61._8_4_ + auVar45._8_4_;
    auVar166._12_4_ = auVar61._12_4_ + auVar45._12_4_;
    auVar175._8_8_ = 0x3f800000;
    auVar175._0_8_ = 0x3f800000;
    auVar45 = vsubps_avx(auVar175,auVar166);
    auVar47 = vsubps_avx512vl(auVar175,auVar58);
    auVar225._0_4_ = fVar204 * auVar45._0_4_;
    auVar225._4_4_ = fVar205 * auVar45._4_4_;
    auVar225._8_4_ = fVar188 * auVar45._8_4_;
    auVar225._12_4_ = fVar203 * auVar45._12_4_;
    auVar222._0_4_ = fVar204 * auVar47._0_4_;
    auVar222._4_4_ = fVar205 * auVar47._4_4_;
    auVar222._8_4_ = fVar188 * auVar47._8_4_;
    auVar222._12_4_ = fVar203 * auVar47._12_4_;
    auVar167._0_4_ = fVar206 * auVar45._0_4_;
    auVar167._4_4_ = fVar189 * auVar45._4_4_;
    auVar167._8_4_ = fVar200 * auVar45._8_4_;
    auVar167._12_4_ = fVar202 * auVar45._12_4_;
    auVar176._0_4_ = fVar206 * auVar47._0_4_;
    auVar176._4_4_ = fVar189 * auVar47._4_4_;
    auVar176._8_4_ = fVar200 * auVar47._8_4_;
    auVar176._12_4_ = fVar202 * auVar47._12_4_;
    auVar45 = vminps_avx(auVar225,auVar222);
    auVar47 = vminps_avx512vl(auVar167,auVar176);
    auVar58 = vminps_avx512vl(auVar45,auVar47);
    auVar45 = vmaxps_avx(auVar222,auVar225);
    auVar47 = vmaxps_avx(auVar176,auVar167);
    auVar47 = vmaxps_avx(auVar47,auVar45);
    auVar50 = vminps_avx512vl(auVar230,auVar54);
    auVar45 = vminps_avx(auVar196,auVar215);
    auVar45 = vminps_avx(auVar50,auVar45);
    auVar45 = vhaddps_avx(auVar58,auVar45);
    auVar50 = vmaxps_avx512vl(auVar54,auVar230);
    auVar58 = vmaxps_avx(auVar215,auVar196);
    auVar58 = vmaxps_avx(auVar58,auVar50);
    auVar47 = vhaddps_avx(auVar47,auVar58);
    auVar45 = vshufps_avx(auVar45,auVar45,0xe8);
    auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
    auVar168._0_4_ = auVar45._0_4_ + auVar53._0_4_;
    auVar168._4_4_ = auVar45._4_4_ + auVar53._4_4_;
    auVar168._8_4_ = auVar45._8_4_ + auVar53._8_4_;
    auVar168._12_4_ = auVar45._12_4_ + auVar53._12_4_;
    auVar177._0_4_ = auVar47._0_4_ + auVar53._0_4_;
    auVar177._4_4_ = auVar47._4_4_ + auVar53._4_4_;
    auVar177._8_4_ = auVar47._8_4_ + auVar53._8_4_;
    auVar177._12_4_ = auVar47._12_4_ + auVar53._12_4_;
    auVar45 = vmaxps_avx(auVar55,auVar168);
    auVar47 = vminps_avx(auVar177,auVar56);
    uVar2 = vcmpps_avx512vl(auVar47,auVar45,1);
  } while ((uVar2 & 3) != 0);
  uVar2 = vcmpps_avx512vl(auVar177,auVar56,1);
  uVar16 = vcmpps_avx512vl(auVar37,auVar168,1);
  if (((ushort)uVar16 & (ushort)uVar2 & 1) == 0) {
    bVar22 = 0;
  }
  else {
    auVar45 = vmovshdup_avx(auVar168);
    bVar22 = auVar48._0_4_ < auVar45._0_4_ & (byte)(uVar2 >> 1) & 0x7f;
  }
  if (((3 < (uint)uVar24 || uVar6 != 0 && !bVar32) | bVar22) != 1) goto LAB_017e314d;
  lVar26 = 0xc9;
  do {
    lVar26 = lVar26 + -1;
    if (lVar26 == 0) goto LAB_017e22a6;
    auVar37 = vsubss_avx512f(auVar40,auVar53);
    fVar200 = auVar37._0_4_;
    fVar206 = fVar200 * fVar200 * fVar200;
    fVar202 = auVar53._0_4_;
    fVar189 = fVar202 * 3.0 * fVar200 * fVar200;
    fVar200 = fVar200 * fVar202 * fVar202 * 3.0;
    auVar133._4_4_ = fVar206;
    auVar133._0_4_ = fVar206;
    auVar133._8_4_ = fVar206;
    auVar133._12_4_ = fVar206;
    auVar126._4_4_ = fVar189;
    auVar126._0_4_ = fVar189;
    auVar126._8_4_ = fVar189;
    auVar126._12_4_ = fVar189;
    auVar101._4_4_ = fVar200;
    auVar101._0_4_ = fVar200;
    auVar101._8_4_ = fVar200;
    auVar101._12_4_ = fVar200;
    fVar202 = fVar202 * fVar202 * fVar202;
    auVar151._0_4_ = (float)local_2a0._0_4_ * fVar202;
    auVar151._4_4_ = (float)local_2a0._4_4_ * fVar202;
    auVar151._8_4_ = fStack_298 * fVar202;
    auVar151._12_4_ = fStack_294 * fVar202;
    auVar37 = vfmadd231ps_fma(auVar151,auVar35,auVar101);
    auVar37 = vfmadd231ps_fma(auVar37,auVar39,auVar126);
    auVar37 = vfmadd231ps_fma(auVar37,auVar34,auVar133);
    auVar102._8_8_ = auVar37._0_8_;
    auVar102._0_8_ = auVar37._0_8_;
    auVar37 = vshufpd_avx(auVar37,auVar37,3);
    auVar45 = vshufps_avx(auVar53,auVar53,0x55);
    auVar37 = vsubps_avx(auVar37,auVar102);
    auVar45 = vfmadd213ps_fma(auVar37,auVar45,auVar102);
    fVar206 = auVar45._0_4_;
    auVar37 = vshufps_avx(auVar45,auVar45,0x55);
    auVar103._0_4_ = auVar36._0_4_ * fVar206 + auVar59._0_4_ * auVar37._0_4_;
    auVar103._4_4_ = auVar36._4_4_ * fVar206 + auVar59._4_4_ * auVar37._4_4_;
    auVar103._8_4_ = auVar36._8_4_ * fVar206 + auVar59._8_4_ * auVar37._8_4_;
    auVar103._12_4_ = auVar36._12_4_ * fVar206 + auVar59._12_4_ * auVar37._12_4_;
    auVar53 = vsubps_avx(auVar53,auVar103);
    auVar37 = vandps_avx512vl(auVar45,auVar236._0_16_);
    auVar45 = vprolq_avx512vl(auVar37,0x20);
    auVar37 = vmaxss_avx(auVar45,auVar37);
    bVar32 = (float)local_2b0._0_4_ < auVar37._0_4_;
  } while ((float)local_2b0._0_4_ <= auVar37._0_4_);
  auVar37 = vucomiss_avx512f(auVar57);
  if (bVar32) goto LAB_017e22a6;
  auVar36 = vucomiss_avx512f(auVar37);
  auVar240 = ZEXT1664(auVar36);
  if (bVar32) goto LAB_017e22a6;
  vmovshdup_avx(auVar37);
  auVar36 = vucomiss_avx512f(auVar57);
  if (bVar32) goto LAB_017e22a6;
  auVar40 = vucomiss_avx512f(auVar36);
  auVar240 = ZEXT1664(auVar40);
  if (bVar32) goto LAB_017e22a6;
  auVar45 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                          ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
  auVar52 = vinsertps_avx(auVar45,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
  auVar45 = vdpps_avx(auVar52,local_2c0,0x7f);
  auVar47 = vdpps_avx(auVar52,local_2d0,0x7f);
  auVar55 = vdpps_avx(auVar52,local_2e0,0x7f);
  auVar58 = vdpps_avx(auVar52,local_2f0,0x7f);
  auVar50 = vdpps_avx(auVar52,local_300,0x7f);
  auVar51 = vdpps_avx(auVar52,local_310,0x7f);
  auVar54 = vdpps_avx(auVar52,local_320,0x7f);
  auVar52 = vdpps_avx(auVar52,local_330,0x7f);
  auVar53 = vsubss_avx512f(auVar40,auVar36);
  fVar206 = auVar36._0_4_;
  auVar36 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar50._0_4_)),auVar53,auVar45);
  auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * fVar206)),auVar53,auVar47);
  auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar206)),auVar53,auVar55);
  auVar55 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar52._0_4_)),auVar53,auVar58);
  auVar40 = vsubss_avx512f(auVar40,auVar37);
  auVar152._0_4_ = auVar40._0_4_;
  fVar206 = auVar152._0_4_ * auVar152._0_4_ * auVar152._0_4_;
  local_120 = auVar37._0_4_;
  fVar189 = local_120 * 3.0 * auVar152._0_4_ * auVar152._0_4_;
  fVar200 = auVar152._0_4_ * local_120 * local_120 * 3.0;
  fVar202 = local_120 * local_120 * local_120;
  auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar202 * auVar55._0_4_)),ZEXT416((uint)fVar200),auVar47)
  ;
  auVar40 = vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar189),auVar45);
  vfmadd231ss_fma(auVar40,ZEXT416((uint)fVar206),auVar36);
  auVar36 = vucomiss_avx512f(ZEXT416(uVar1));
  if (bVar32) goto LAB_017e22a6;
  fVar204 = *(float *)(ray + k * 4 + 0x100);
  if (fVar204 < auVar36._0_4_) goto LAB_017e22a6;
  auVar40 = vshufps_avx(auVar37,auVar37,0x55);
  auVar47 = vsubps_avx512vl(auVar237,auVar40);
  fVar205 = auVar40._0_4_;
  auVar178._0_4_ = fVar205 * (float)local_350._0_4_;
  fVar188 = auVar40._4_4_;
  auVar178._4_4_ = fVar188 * (float)local_350._4_4_;
  fVar203 = auVar40._8_4_;
  auVar178._8_4_ = fVar203 * fStack_348;
  fVar207 = auVar40._12_4_;
  auVar178._12_4_ = fVar207 * fStack_344;
  auVar186._0_4_ = fVar205 * (float)local_3a0._0_4_;
  auVar186._4_4_ = fVar188 * (float)local_3a0._4_4_;
  auVar186._8_4_ = fVar203 * fStack_398;
  auVar186._12_4_ = fVar207 * fStack_394;
  auVar197._0_4_ = fVar205 * (float)local_3b0._0_4_;
  auVar197._4_4_ = fVar188 * (float)local_3b0._4_4_;
  auVar197._8_4_ = fVar203 * fStack_3a8;
  auVar197._12_4_ = fVar207 * fStack_3a4;
  auVar158._0_4_ = fVar205 * (float)local_370._0_4_;
  auVar158._4_4_ = fVar188 * (float)local_370._4_4_;
  auVar158._8_4_ = fVar203 * fStack_368;
  auVar158._12_4_ = fVar207 * fStack_364;
  auVar237 = vfmadd231ps_fma(auVar178,auVar47,local_340);
  auVar40 = vfmadd231ps_fma(auVar186,auVar47,local_380);
  auVar45 = vfmadd231ps_fma(auVar197,auVar47,local_390);
  auVar47 = vfmadd231ps_fma(auVar158,auVar47,local_360);
  auVar237 = vsubps_avx(auVar40,auVar237);
  auVar40 = vsubps_avx(auVar45,auVar40);
  auVar45 = vsubps_avx(auVar47,auVar45);
  auVar198._0_4_ = local_120 * auVar40._0_4_;
  auVar198._4_4_ = local_120 * auVar40._4_4_;
  auVar198._8_4_ = local_120 * auVar40._8_4_;
  auVar198._12_4_ = local_120 * auVar40._12_4_;
  auVar152._4_4_ = auVar152._0_4_;
  auVar152._8_4_ = auVar152._0_4_;
  auVar152._12_4_ = auVar152._0_4_;
  auVar237 = vfmadd231ps_fma(auVar198,auVar152,auVar237);
  auVar159._0_4_ = local_120 * auVar45._0_4_;
  auVar159._4_4_ = local_120 * auVar45._4_4_;
  auVar159._8_4_ = local_120 * auVar45._8_4_;
  auVar159._12_4_ = local_120 * auVar45._12_4_;
  auVar40 = vfmadd231ps_fma(auVar159,auVar152,auVar40);
  auVar160._0_4_ = local_120 * auVar40._0_4_;
  auVar160._4_4_ = local_120 * auVar40._4_4_;
  auVar160._8_4_ = local_120 * auVar40._8_4_;
  auVar160._12_4_ = local_120 * auVar40._12_4_;
  auVar237 = vfmadd231ps_fma(auVar160,auVar152,auVar237);
  auVar62 = vmulps_avx512vl(auVar237,auVar62);
  pGVar7 = (context->scene->geometries).items[uVar5].ptr;
  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
       (bVar22 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_017e3130;
    auVar146._0_4_ = fVar202 * (float)local_400._0_4_;
    auVar146._4_4_ = fVar202 * (float)local_400._4_4_;
    auVar146._8_4_ = fVar202 * fStack_3f8;
    auVar146._12_4_ = fVar202 * fStack_3f4;
    auVar134._4_4_ = fVar200;
    auVar134._0_4_ = fVar200;
    auVar134._8_4_ = fVar200;
    auVar134._12_4_ = fVar200;
    auVar237 = vfmadd132ps_fma(auVar134,auVar146,local_3f0);
    auVar127._4_4_ = fVar189;
    auVar127._0_4_ = fVar189;
    auVar127._8_4_ = fVar189;
    auVar127._12_4_ = fVar189;
    auVar237 = vfmadd132ps_fma(auVar127,auVar237,local_3e0);
    auVar120._4_4_ = fVar206;
    auVar120._0_4_ = fVar206;
    auVar120._8_4_ = fVar206;
    auVar120._12_4_ = fVar206;
    auVar45 = vfmadd132ps_fma(auVar120,auVar237,local_3d0);
    auVar237 = vshufps_avx(auVar45,auVar45,0xc9);
    auVar40 = vshufps_avx(auVar62,auVar62,0xc9);
    auVar121._0_4_ = auVar45._0_4_ * auVar40._0_4_;
    auVar121._4_4_ = auVar45._4_4_ * auVar40._4_4_;
    auVar121._8_4_ = auVar45._8_4_ * auVar40._8_4_;
    auVar121._12_4_ = auVar45._12_4_ * auVar40._12_4_;
    auVar62 = vfmsub231ps_fma(auVar121,auVar62,auVar237);
    auVar135._8_4_ = 1;
    auVar135._0_8_ = 0x100000001;
    auVar135._12_4_ = 1;
    auVar135._16_4_ = 1;
    auVar135._20_4_ = 1;
    auVar135._24_4_ = 1;
    auVar135._28_4_ = 1;
    local_100 = vpermps_avx2(auVar135,ZEXT1632(auVar37));
    auVar80 = vpermps_avx2(auVar135,ZEXT1632(auVar62));
    auVar147._8_4_ = 2;
    auVar147._0_8_ = 0x200000002;
    auVar147._12_4_ = 2;
    auVar147._16_4_ = 2;
    auVar147._20_4_ = 2;
    auVar147._24_4_ = 2;
    auVar147._28_4_ = 2;
    local_160 = vpermps_avx2(auVar147,ZEXT1632(auVar62));
    local_140 = auVar62._0_4_;
    local_180[0] = (RTCHitN)auVar80[0];
    local_180[1] = (RTCHitN)auVar80[1];
    local_180[2] = (RTCHitN)auVar80[2];
    local_180[3] = (RTCHitN)auVar80[3];
    local_180[4] = (RTCHitN)auVar80[4];
    local_180[5] = (RTCHitN)auVar80[5];
    local_180[6] = (RTCHitN)auVar80[6];
    local_180[7] = (RTCHitN)auVar80[7];
    local_180[8] = (RTCHitN)auVar80[8];
    local_180[9] = (RTCHitN)auVar80[9];
    local_180[10] = (RTCHitN)auVar80[10];
    local_180[0xb] = (RTCHitN)auVar80[0xb];
    local_180[0xc] = (RTCHitN)auVar80[0xc];
    local_180[0xd] = (RTCHitN)auVar80[0xd];
    local_180[0xe] = (RTCHitN)auVar80[0xe];
    local_180[0xf] = (RTCHitN)auVar80[0xf];
    local_180[0x10] = (RTCHitN)auVar80[0x10];
    local_180[0x11] = (RTCHitN)auVar80[0x11];
    local_180[0x12] = (RTCHitN)auVar80[0x12];
    local_180[0x13] = (RTCHitN)auVar80[0x13];
    local_180[0x14] = (RTCHitN)auVar80[0x14];
    local_180[0x15] = (RTCHitN)auVar80[0x15];
    local_180[0x16] = (RTCHitN)auVar80[0x16];
    local_180[0x17] = (RTCHitN)auVar80[0x17];
    local_180[0x18] = (RTCHitN)auVar80[0x18];
    local_180[0x19] = (RTCHitN)auVar80[0x19];
    local_180[0x1a] = (RTCHitN)auVar80[0x1a];
    local_180[0x1b] = (RTCHitN)auVar80[0x1b];
    local_180[0x1c] = (RTCHitN)auVar80[0x1c];
    local_180[0x1d] = (RTCHitN)auVar80[0x1d];
    local_180[0x1e] = (RTCHitN)auVar80[0x1e];
    local_180[0x1f] = (RTCHitN)auVar80[0x1f];
    uStack_13c = local_140;
    uStack_138 = local_140;
    uStack_134 = local_140;
    uStack_130 = local_140;
    uStack_12c = local_140;
    uStack_128 = local_140;
    uStack_124 = local_140;
    fStack_11c = local_120;
    fStack_118 = local_120;
    fStack_114 = local_120;
    fStack_110 = local_120;
    fStack_10c = local_120;
    fStack_108 = local_120;
    fStack_104 = local_120;
    local_e0 = local_1e0._0_8_;
    uStack_d8 = local_1e0._8_8_;
    uStack_d0 = local_1e0._16_8_;
    uStack_c8 = local_1e0._24_8_;
    local_c0 = local_200;
    vpcmpeqd_avx2(local_200,local_200);
    uStack_9c = context->user->instID[0];
    local_a0 = uStack_9c;
    uStack_98 = uStack_9c;
    uStack_94 = uStack_9c;
    uStack_90 = uStack_9c;
    uStack_8c = uStack_9c;
    uStack_88 = uStack_9c;
    uStack_84 = uStack_9c;
    uStack_7c = context->user->instPrimID[0];
    local_80 = uStack_7c;
    uStack_78 = uStack_7c;
    uStack_74 = uStack_7c;
    uStack_70 = uStack_7c;
    uStack_6c = uStack_7c;
    uStack_68 = uStack_7c;
    uStack_64 = uStack_7c;
    *(float *)(ray + k * 4 + 0x100) = auVar36._0_4_;
    local_420 = local_220;
    local_450.valid = (int *)local_420;
    local_450.geometryUserPtr = pGVar7->userPtr;
    local_450.context = context->user;
    local_450.ray = (RTCRayN *)ray;
    local_450.hit = local_180;
    local_450.N = 8;
    if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
      (*pGVar7->occlusionFilterN)(&local_450);
      auVar37 = vxorps_avx512vl(auVar57,auVar57);
      auVar239 = ZEXT1664(auVar37);
      auVar240 = ZEXT464(0x3f800000);
      auVar235 = ZEXT3264(_DAT_01fb9fe0);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar234 = ZEXT1664(auVar37);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar233 = ZEXT3264(auVar80);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar232 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar231 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar238 = ZEXT1664(auVar37);
      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar236 = ZEXT1664(auVar37);
    }
    auVar37 = auVar239._0_16_;
    if (local_420 != (undefined1  [32])0x0) {
      p_Var10 = context->args->filter;
      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
           RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
        (*p_Var10)(&local_450);
        auVar37 = vxorps_avx512vl(auVar37,auVar37);
        auVar239 = ZEXT1664(auVar37);
        auVar240 = ZEXT464(0x3f800000);
        auVar235 = ZEXT3264(_DAT_01fb9fe0);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
        auVar234 = ZEXT1664(auVar37);
        auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar233 = ZEXT3264(auVar80);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar232 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
        auVar231 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar238 = ZEXT1664(auVar37);
        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar236 = ZEXT1664(auVar37);
      }
      uVar2 = vptestmd_avx512vl(local_420,local_420);
      auVar80 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      bVar32 = (bool)((byte)uVar2 & 1);
      bVar33 = (bool)((byte)(uVar2 >> 1) & 1);
      bVar30 = (bool)((byte)(uVar2 >> 2) & 1);
      bVar31 = (bool)((byte)(uVar2 >> 3) & 1);
      bVar12 = (bool)((byte)(uVar2 >> 4) & 1);
      bVar13 = (bool)((byte)(uVar2 >> 5) & 1);
      bVar14 = (bool)((byte)(uVar2 >> 6) & 1);
      bVar15 = SUB81(uVar2 >> 7,0);
      *(uint *)(local_450.ray + 0x100) =
           (uint)bVar32 * auVar80._0_4_ | (uint)!bVar32 * *(int *)(local_450.ray + 0x100);
      *(uint *)(local_450.ray + 0x104) =
           (uint)bVar33 * auVar80._4_4_ | (uint)!bVar33 * *(int *)(local_450.ray + 0x104);
      *(uint *)(local_450.ray + 0x108) =
           (uint)bVar30 * auVar80._8_4_ | (uint)!bVar30 * *(int *)(local_450.ray + 0x108);
      *(uint *)(local_450.ray + 0x10c) =
           (uint)bVar31 * auVar80._12_4_ | (uint)!bVar31 * *(int *)(local_450.ray + 0x10c);
      *(uint *)(local_450.ray + 0x110) =
           (uint)bVar12 * auVar80._16_4_ | (uint)!bVar12 * *(int *)(local_450.ray + 0x110);
      *(uint *)(local_450.ray + 0x114) =
           (uint)bVar13 * auVar80._20_4_ | (uint)!bVar13 * *(int *)(local_450.ray + 0x114);
      *(uint *)(local_450.ray + 0x118) =
           (uint)bVar14 * auVar80._24_4_ | (uint)!bVar14 * *(int *)(local_450.ray + 0x118);
      *(uint *)(local_450.ray + 0x11c) =
           (uint)bVar15 * auVar80._28_4_ | (uint)!bVar15 * *(int *)(local_450.ray + 0x11c);
      bVar22 = 1;
      if (local_420 != (undefined1  [32])0x0) goto LAB_017e3130;
    }
    *(float *)(ray + k * 4 + 0x100) = fVar204;
  }
  bVar22 = 0;
LAB_017e3130:
  bVar11 = (bool)(bVar11 | bVar22);
  goto LAB_017e22a6;
LAB_017e314d:
  auVar60 = vinsertps_avx(auVar48,auVar49,0x10);
  goto LAB_017e1da0;
}

Assistant:

static __forceinline bool occluded_hn(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }